

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileAPICodemodel.cxx
# Opt level: O1

Value * __thiscall
anon_unknown.dwarf_1dea53b::Target::Dump(Value *__return_storage_ptr__,Target *this)

{
  ulong *puVar1;
  size_t *psVar2;
  _Link_type __k;
  pointer *pppcVar3;
  cmMakefile *pcVar4;
  cmInstallTargetGenerator *this_00;
  pointer pcVar5;
  pointer pcVar6;
  cmListFileBacktrace *pcVar7;
  void *pvVar8;
  size_type sVar9;
  pointer pSVar10;
  pointer pSVar11;
  __node_type *p_Var12;
  long *plVar13;
  undefined1 auVar14 [16];
  uint uVar15;
  pointer pJVar16;
  mapped_type_conflict2 mVar17;
  _Rb_tree_color *p_Var18;
  pointer pJVar19;
  pointer pIVar20;
  pointer ppcVar21;
  pointer pbVar22;
  pointer puVar23;
  bool bVar24;
  TargetType targetType;
  JBTIndex JVar27;
  ArrayIndex si;
  JBTIndex *__cur;
  TargetType TVar25;
  int iVar26;
  string *psVar28;
  Value *pVVar29;
  cmLocalGenerator *pcVar30;
  string *psVar31;
  vector<cmInstallTargetGenerator_*,_std::allocator<cmInstallTargetGenerator_*>_> *__x;
  OutputInfo *pOVar32;
  undefined8 *puVar33;
  cmValue cVar34;
  cmGlobalGenerator *this_01;
  TargetDependSet *pTVar35;
  _Base_ptr p_Var36;
  iterator iVar37;
  _Rb_tree_node_base *p_Var38;
  byte extraout_var;
  BTs<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *pBVar39;
  pointer pJVar40;
  ulong uVar41;
  pointer pJVar42;
  undefined8 uVar43;
  cmFileSet *this_02;
  mapped_type_conflict2 *pmVar44;
  KindedSources *pKVar45;
  pointer pJVar46;
  _Base_ptr __dest;
  long lVar47;
  vector<(anonymous_namespace)::JBT<std::__cxx11::string>,std::allocator<(anonymous_namespace)::JBT<std::__cxx11::string>>>
  *pvVar48;
  _Base_ptr p_Var49;
  JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *pJVar50;
  JBTIndex bt;
  JBTIndex bt_00;
  string *extraout_RDX;
  string *extraout_RDX_00;
  string *extraout_RDX_01;
  string *extraout_RDX_02;
  IncludeEntry *extraout_RDX_03;
  IncludeEntry *extraout_RDX_04;
  IncludeEntry *extraout_RDX_05;
  IncludeEntry *pIVar51;
  IncludeEntry *extraout_RDX_06;
  _Rb_tree_header *p_Var52;
  _Vector_base<(anonymous_namespace)::JBTIndex,_std::allocator<(anonymous_namespace)::JBTIndex>_>
  *p_Var53;
  pointer pJVar54;
  pointer sk;
  pointer value;
  ulong uVar55;
  vector<(anonymous_namespace)::JBT<std::__cxx11::string>,std::allocator<(anonymous_namespace)::JBT<std::__cxx11::string>>>
  *pvVar56;
  JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *this_03;
  Target *pTVar57;
  iterator iVar58;
  Comments *pCVar59;
  pointer pCVar60;
  pointer pJVar61;
  _Head_base<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_false>
  _Var62;
  __uniq_ptr_impl<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
  _Var63;
  _Link_type __p;
  _Rb_tree_node_base *__x_00;
  cmListFileBacktrace *__n;
  pointer pcVar64;
  pointer ppcVar65;
  ValueHolder VVar66;
  BacktraceData *this_04;
  _Base_ptr p_Var67;
  unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
  *entry;
  _Rb_tree_node_base *p_Var68;
  BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *pBVar69;
  cmListFileBacktrace *bt_01;
  pointer in;
  pointer cge;
  _Base_ptr p_Var70;
  vector<(anonymous_namespace)::JBT<std::__cxx11::string>,std::allocator<(anonymous_namespace)::JBT<std::__cxx11::string>>>
  *pvVar71;
  JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *pJVar72;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar73;
  JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *pJVar74;
  BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *bt_02;
  pair<std::_Rb_tree_node_base_*,_std::_Rb_tree_node_base_*> pVar75;
  static_string_view sVar76;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_00;
  pointer local_378;
  pointer local_370;
  string p;
  size_type __dnew;
  BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *local_320;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_318;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_308;
  Value artifact;
  undefined1 local_2c8 [16];
  _Alloc_hider local_2b8;
  undefined1 local_2b0 [8];
  undefined1 local_2a8 [32];
  pointer local_288;
  vector<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_280;
  vector<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_268;
  pointer local_250;
  pointer local_248;
  pointer local_240;
  vector<(anonymous_namespace)::CompileData::IncludeEntry,_std::allocator<(anonymous_namespace)::CompileData::IncludeEntry>_>
  local_238;
  vector<(anonymous_namespace)::CompileData::IncludeEntry,_std::allocator<(anonymous_namespace)::CompileData::IncludeEntry>_>
  local_220;
  pointer local_208;
  string obj_dir;
  vector<cmInstallTargetGenerator_*,_std::allocator<cmInstallTargetGenerator_*>_> installGens;
  Value launchers;
  _Base_ptr local_170 [6];
  __node_base local_140;
  string *local_138;
  BacktraceData *local_130;
  _Rb_tree_node_base *local_128;
  Value folder;
  Value dependencies;
  Value compileGroups;
  Value sourceGroups;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  directories;
  vector<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>,_std::allocator<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>_>_>
  fileEntries;
  vector<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>,_std::allocator<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>_>_>
  directoryEntries;
  
  Json::Value::Value(__return_storage_ptr__,objectValue);
  targetType = cmGeneratorTarget::GetType(this->GT);
  psVar28 = cmGeneratorTarget::GetName_abi_cxx11_(this->GT);
  Json::Value::Value(&artifact,psVar28);
  pVVar29 = Json::Value::operator[](__return_storage_ptr__,"name");
  Json::Value::operator=(pVVar29,&artifact);
  Json::Value::~Value(&artifact);
  psVar28 = cmState::GetTargetTypeName_abi_cxx11_(targetType);
  Json::Value::Value(&artifact,psVar28);
  pVVar29 = Json::Value::operator[](__return_storage_ptr__,"type");
  Json::Value::operator=(pVVar29,&artifact);
  Json::Value::~Value(&artifact);
  psVar28 = &this->TopBuild;
  TargetId((string *)&launchers,this->GT,psVar28);
  Json::Value::Value(&artifact,(String *)&launchers);
  pVVar29 = Json::Value::operator[](__return_storage_ptr__,"id");
  Json::Value::operator=(pVVar29,&artifact);
  Json::Value::~Value(&artifact);
  if (launchers.value_ != &launchers.comments_) {
    operator_delete(launchers.value_.string_,
                    (long)launchers.comments_.ptr_._M_t.
                          super___uniq_ptr_impl<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
                          .
                          super__Head_base<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_false>
                          ._M_head_impl + 1);
  }
  Json::Value::Value(&launchers,objectValue);
  pcVar30 = cmGeneratorTarget::GetLocalGenerator(this->GT);
  psVar31 = cmLocalGenerator::GetCurrentSourceDirectory_abi_cxx11_(pcVar30);
  local_138 = &this->TopSource;
  cmSystemTools::RelativeIfUnder(&p,local_138,psVar31);
  Json::Value::Value(&artifact,&p);
  pVVar29 = Json::Value::operator[](&launchers,"source");
  Json::Value::operator=(pVVar29,&artifact);
  Json::Value::~Value(&artifact);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)p._M_dataplus._M_p != &p.field_2) {
    operator_delete(p._M_dataplus._M_p,p.field_2._M_allocated_capacity + 1);
  }
  psVar31 = cmLocalGenerator::GetCurrentBinaryDirectory_abi_cxx11_(pcVar30);
  cmSystemTools::RelativeIfUnder(&p,psVar28,psVar31);
  Json::Value::Value(&artifact,&p);
  pVVar29 = Json::Value::operator[](&launchers,"build");
  Json::Value::operator=(pVVar29,&artifact);
  Json::Value::~Value(&artifact);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)p._M_dataplus._M_p != &p.field_2) {
    operator_delete(p._M_dataplus._M_p,p.field_2._M_allocated_capacity + 1);
  }
  pVVar29 = Json::Value::operator[](__return_storage_ptr__,"paths");
  Json::Value::operator=(pVVar29,&launchers);
  Json::Value::~Value(&launchers);
  bVar24 = cmTarget::GetIsGeneratorProvided(this->GT->Target);
  if (bVar24) {
    Json::Value::Value(&artifact,true);
    pVVar29 = Json::Value::operator[](__return_storage_ptr__,"isGeneratorProvided");
    Json::Value::operator=(pVVar29,&artifact);
    Json::Value::~Value(&artifact);
  }
  cmGeneratorTarget::GetBacktrace((cmGeneratorTarget *)&artifact);
  AddBacktrace(this,__return_storage_ptr__,(cmListFileBacktrace *)&artifact);
  if (artifact._8_8_ != 0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)artifact._8_8_);
  }
  bVar24 = cmTarget::GetHaveInstallRule(this->GT->Target);
  if (bVar24) {
    Json::Value::Value((Value *)&obj_dir,objectValue);
    Json::Value::Value(&launchers,objectValue);
    pcVar4 = this->GT->Makefile;
    __dnew = 0x14;
    artifact.value_ = (ValueHolder)&artifact.comments_;
    artifact.value_.int_ = std::__cxx11::string::_M_create((ulong *)&artifact,(ulong)&__dnew);
    artifact.comments_.ptr_._M_t.
    super___uniq_ptr_impl<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
    .
    super__Head_base<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_false>
    ._M_head_impl._0_4_ = (uint)__dnew;
    artifact.comments_.ptr_._M_t.
    super___uniq_ptr_impl<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
    .
    super__Head_base<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_false>
    ._M_head_impl._4_1_ = (undefined1)(__dnew >> 0x20);
    artifact.comments_.ptr_._M_t.
    super___uniq_ptr_impl<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
    .
    super__Head_base<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_false>
    ._M_head_impl._5_1_ = (undefined1)(__dnew >> 0x28);
    artifact.comments_.ptr_._M_t.
    super___uniq_ptr_impl<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
    .
    super__Head_base<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_false>
    ._M_head_impl._6_1_ = (undefined1)(__dnew >> 0x30);
    artifact.comments_.ptr_._M_t.
    super___uniq_ptr_impl<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
    .
    super__Head_base<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_false>
    ._M_head_impl._7_1_ = (undefined1)(__dnew >> 0x38);
    builtin_strncpy((char *)artifact.value_,"CMAKE_IN",8);
    *(undefined8 *)&((artifact.value_.map_)->_M_t)._M_impl.super__Rb_tree_header._M_header =
         0x52505f4c4c415453;
    *(undefined4 *)&((artifact.value_.map_)->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent
         = 0x58494645;
    artifact._8_8_ = __dnew;
    artifact.value_.string_[__dnew] = '\0';
    psVar31 = cmMakefile::GetSafeDefinition(pcVar4,(string *)&artifact);
    p._M_dataplus._M_p = (pointer)&p.field_2;
    pcVar64 = (psVar31->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&p,pcVar64,pcVar64 + psVar31->_M_string_length);
    if (artifact.value_ != &artifact.comments_) {
      operator_delete(artifact.value_.string_,
                      CONCAT17(artifact.comments_.ptr_._M_t.
                               super___uniq_ptr_impl<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
                               .
                               super__Head_base<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_false>
                               ._M_head_impl._7_1_,
                               CONCAT16(artifact.comments_.ptr_._M_t.
                                        super___uniq_ptr_impl<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
                                        ._M_t.
                                        super__Tuple_impl<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
                                        .
                                        super__Head_base<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_false>
                                        ._M_head_impl._6_1_,
                                        CONCAT15(artifact.comments_.ptr_._M_t.
                                                 super___uniq_ptr_impl<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
                                                 ._M_t.
                                                 super__Tuple_impl<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
                                                 .
                                                 super__Head_base<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_false>
                                                 ._M_head_impl._5_1_,
                                                 CONCAT14(artifact.comments_.ptr_._M_t.
                                                                                                                    
                                                  super___uniq_ptr_impl<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_false>
                                                  ._M_head_impl._4_1_,
                                                  (uint)artifact.comments_.ptr_._M_t.
                                                                                                                
                                                  super___uniq_ptr_impl<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_false>
                                                  ._M_head_impl)))) + 1);
    }
    cmsys::SystemTools::ConvertToUnixSlashes(&p);
    Json::Value::Value(&artifact,&p);
    pVVar29 = Json::Value::operator[](&launchers,"path");
    Json::Value::operator=(pVVar29,&artifact);
    Json::Value::~Value(&artifact);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)p._M_dataplus._M_p != &p.field_2) {
      operator_delete(p._M_dataplus._M_p,p.field_2._M_allocated_capacity + 1);
    }
    pVVar29 = Json::Value::operator[]((Value *)&obj_dir,"prefix");
    Json::Value::operator=(pVVar29,&launchers);
    Json::Value::~Value(&launchers);
    Json::Value::Value((Value *)&p,arrayValue);
    __x = cmTarget::GetInstallGenerators(this->GT->Target);
    std::vector<cmInstallTargetGenerator_*,_std::allocator<cmInstallTargetGenerator_*>_>::vector
              (&installGens,__x);
    ppcVar21 = installGens.
               super__Vector_base<cmInstallTargetGenerator_*,_std::allocator<cmInstallTargetGenerator_*>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    if (installGens.
        super__Vector_base<cmInstallTargetGenerator_*,_std::allocator<cmInstallTargetGenerator_*>_>.
        _M_impl.super__Vector_impl_data._M_start !=
        installGens.
        super__Vector_base<cmInstallTargetGenerator_*,_std::allocator<cmInstallTargetGenerator_*>_>.
        _M_impl.super__Vector_impl_data._M_finish) {
      ppcVar65 = installGens.
                 super__Vector_base<cmInstallTargetGenerator_*,_std::allocator<cmInstallTargetGenerator_*>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      do {
        this_00 = *ppcVar65;
        Json::Value::Value(&launchers,objectValue);
        cmInstallTargetGenerator::GetDestination((string *)&__dnew,this_00,this->Config);
        Json::Value::Value(&artifact,(string *)&__dnew);
        pVVar29 = Json::Value::operator[](&launchers,"path");
        Json::Value::operator=(pVVar29,&artifact);
        Json::Value::~Value(&artifact);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)__dnew != &local_318) {
          operator_delete((void *)__dnew,local_318._M_allocated_capacity + 1);
        }
        AddBacktrace(this,&launchers,&(this_00->super_cmInstallGenerator).Backtrace);
        Json::Value::append((Value *)&p,&launchers);
        Json::Value::~Value(&launchers);
        ppcVar65 = ppcVar65 + 1;
      } while (ppcVar65 != ppcVar21);
    }
    if (installGens.
        super__Vector_base<cmInstallTargetGenerator_*,_std::allocator<cmInstallTargetGenerator_*>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(installGens.
                      super__Vector_base<cmInstallTargetGenerator_*,_std::allocator<cmInstallTargetGenerator_*>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)installGens.
                            super__Vector_base<cmInstallTargetGenerator_*,_std::allocator<cmInstallTargetGenerator_*>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)installGens.
                            super__Vector_base<cmInstallTargetGenerator_*,_std::allocator<cmInstallTargetGenerator_*>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    pVVar29 = Json::Value::operator[]((Value *)&obj_dir,"destinations");
    Json::Value::operator=(pVVar29,(Value *)&p);
    Json::Value::~Value((Value *)&p);
    pVVar29 = Json::Value::operator[](__return_storage_ptr__,"install");
    Json::Value::operator=(pVVar29,(Value *)&obj_dir);
    Json::Value::~Value((Value *)&obj_dir);
  }
  bVar24 = cmGeneratorTarget::HaveWellDefinedOutputFiles(this->GT);
  if (bVar24) {
    Json::Value::Value((Value *)&p,arrayValue);
    TVar25 = cmGeneratorTarget::GetType(this->GT);
    if (TVar25 == OBJECT_LIBRARY) {
      bVar24 = cmTarget::HasKnownObjectFileLocation(this->GT->Target,(string *)0x0);
      if (bVar24) {
        dependencies.value_.int_ = 0;
        dependencies.bits_ = (anon_struct_4_2_14fb5ae2_for_bits_)0x0;
        dependencies._12_4_ = 0;
        dependencies.comments_.ptr_._M_t.
        super___uniq_ptr_impl<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
        .
        super__Head_base<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_false>
        ._M_head_impl =
             (unique_ptr<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
              )(__uniq_ptr_data<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>,_true,_true>
                )0x0;
        cmGeneratorTarget::GetObjectSources
                  (this->GT,(vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> *)
                            &dependencies,this->Config);
        cmGeneratorTarget::GetObjectDirectory(&obj_dir,this->GT,this->Config);
        uVar43 = dependencies._8_8_;
        if (dependencies.value_.int_ != dependencies._8_8_) {
          VVar66 = dependencies.value_;
          do {
            psVar31 = cmGeneratorTarget::GetObjectName_abi_cxx11_
                                (this->GT,*(cmSourceFile **)VVar66.string_);
            Json::Value::Value(&artifact,objectValue);
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &installGens,&obj_dir,psVar31);
            cmSystemTools::RelativeIfUnder
                      ((string *)&__dnew,psVar28,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &installGens);
            Json::Value::Value(&launchers,(string *)&__dnew);
            pVVar29 = Json::Value::operator[](&artifact,"path");
            Json::Value::operator=(pVVar29,&launchers);
            Json::Value::~Value(&launchers);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)__dnew != &local_318) {
              operator_delete((void *)__dnew,local_318._M_allocated_capacity + 1);
            }
            if (installGens.
                super__Vector_base<cmInstallTargetGenerator_*,_std::allocator<cmInstallTargetGenerator_*>_>
                ._M_impl.super__Vector_impl_data._M_start !=
                (pointer)&installGens.
                          super__Vector_base<cmInstallTargetGenerator_*,_std::allocator<cmInstallTargetGenerator_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage) {
              operator_delete(installGens.
                              super__Vector_base<cmInstallTargetGenerator_*,_std::allocator<cmInstallTargetGenerator_*>_>
                              ._M_impl.super__Vector_impl_data._M_start,
                              (long)installGens.
                                    super__Vector_base<cmInstallTargetGenerator_*,_std::allocator<cmInstallTargetGenerator_*>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage + 1);
            }
            Json::Value::append((Value *)&p,&artifact);
            Json::Value::~Value(&artifact);
            VVar66.string_ = (char *)&((VVar66.map_)->_M_t)._M_impl.super__Rb_tree_header;
          } while (VVar66.int_ != uVar43);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)obj_dir._M_dataplus._M_p != &obj_dir.field_2) {
          operator_delete(obj_dir._M_dataplus._M_p,obj_dir.field_2._M_allocated_capacity + 1);
        }
        if (dependencies.value_.int_ != 0) {
          operator_delete(dependencies.value_.string_,
                          (long)dependencies.comments_.ptr_._M_t.
                                super___uniq_ptr_impl<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
                                .
                                super__Head_base<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_false>
                                ._M_head_impl - (long)dependencies.value_);
        }
      }
    }
    else {
      Json::Value::Value(&artifact,objectValue);
      cmGeneratorTarget::GetFullPath
                ((string *)&__dnew,this->GT,this->Config,RuntimeBinaryArtifact,false);
      cmSystemTools::RelativeIfUnder(&obj_dir,psVar28,(string *)&__dnew);
      Json::Value::Value(&launchers,&obj_dir);
      pVVar29 = Json::Value::operator[](&artifact,"path");
      Json::Value::operator=(pVVar29,&launchers);
      Json::Value::~Value(&launchers);
      paVar73 = &obj_dir.field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)obj_dir._M_dataplus._M_p != paVar73) {
        operator_delete(obj_dir._M_dataplus._M_p,obj_dir.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)__dnew != &local_318) {
        operator_delete((void *)__dnew,local_318._M_allocated_capacity + 1);
      }
      Json::Value::append((Value *)&p,&artifact);
      Json::Value::~Value(&artifact);
      bVar24 = cmGeneratorTarget::HasImportLibrary(this->GT,this->Config);
      if (bVar24) {
        Json::Value::Value(&artifact,objectValue);
        cmGeneratorTarget::GetFullPath
                  ((string *)&__dnew,this->GT,this->Config,ImportLibraryArtifact,false);
        cmSystemTools::RelativeIfUnder(&obj_dir,psVar28,(string *)&__dnew);
        Json::Value::Value(&launchers,&obj_dir);
        pVVar29 = Json::Value::operator[](&artifact,"path");
        Json::Value::operator=(pVVar29,&launchers);
        Json::Value::~Value(&launchers);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)obj_dir._M_dataplus._M_p != paVar73) {
          operator_delete(obj_dir._M_dataplus._M_p,obj_dir.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)__dnew != &local_318) {
          operator_delete((void *)__dnew,local_318._M_allocated_capacity + 1);
        }
        Json::Value::append((Value *)&p,&artifact);
        Json::Value::~Value(&artifact);
      }
      bVar24 = cmGeneratorTarget::IsDLLPlatform(this->GT);
      if ((((bVar24) && (TVar25 = cmGeneratorTarget::GetType(this->GT), TVar25 != STATIC_LIBRARY))
          && (pOVar32 = cmGeneratorTarget::GetOutputInfo(this->GT,this->Config),
             pOVar32 != (OutputInfo *)0x0)) && ((pOVar32->PdbDir)._M_string_length != 0)) {
        Json::Value::Value(&artifact,objectValue);
        pppcVar3 = &installGens.
                    super__Vector_base<cmInstallTargetGenerator_*,_std::allocator<cmInstallTargetGenerator_*>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage;
        pcVar64 = (pOVar32->PdbDir)._M_dataplus._M_p;
        installGens.
        super__Vector_base<cmInstallTargetGenerator_*,_std::allocator<cmInstallTargetGenerator_*>_>.
        _M_impl.super__Vector_impl_data._M_start = (pointer)pppcVar3;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&installGens,pcVar64,pcVar64 + (pOVar32->PdbDir)._M_string_length);
        std::__cxx11::string::_M_replace_aux
                  ((ulong)&installGens,
                   (ulong)installGens.
                          super__Vector_base<cmInstallTargetGenerator_*,_std::allocator<cmInstallTargetGenerator_*>_>
                          ._M_impl.super__Vector_impl_data._M_finish,0,'\x01');
        cmGeneratorTarget::GetPDBName((string *)&dependencies,this->GT,this->Config);
        _Var62._M_head_impl =
             (array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>
              *)(array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>
                 *)0xf;
        if (installGens.
            super__Vector_base<cmInstallTargetGenerator_*,_std::allocator<cmInstallTargetGenerator_*>_>
            ._M_impl.super__Vector_impl_data._M_start != (pointer)pppcVar3) {
          _Var62._M_head_impl =
               (array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>
                *)installGens.
                  super__Vector_base<cmInstallTargetGenerator_*,_std::allocator<cmInstallTargetGenerator_*>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage;
        }
        if (_Var62._M_head_impl <
            (ulong)(dependencies._8_8_ +
                   (long)installGens.
                         super__Vector_base<cmInstallTargetGenerator_*,_std::allocator<cmInstallTargetGenerator_*>_>
                         ._M_impl.super__Vector_impl_data._M_finish)) {
          _Var63._M_t.
          super__Tuple_impl<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
          .
          super__Head_base<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_false>
          ._M_head_impl =
               (_Tuple_impl<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
                )(_Head_base<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_false>
                  )0xf;
          if (dependencies.value_ != &dependencies.comments_) {
            _Var63._M_t.
            super__Tuple_impl<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
            .
            super__Head_base<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_false>
            ._M_head_impl =
                 (tuple<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
                  )(tuple<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
                    )dependencies.comments_;
          }
          if ((ulong)_Var63._M_t.
                     super__Tuple_impl<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
                     .
                     super__Head_base<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_false>
                     ._M_head_impl <
              (ulong)(dependencies._8_8_ +
                     (long)installGens.
                           super__Vector_base<cmInstallTargetGenerator_*,_std::allocator<cmInstallTargetGenerator_*>_>
                           ._M_impl.super__Vector_impl_data._M_finish)) goto LAB_004c647d;
          puVar33 = (undefined8 *)
                    std::__cxx11::string::replace
                              ((ulong)&dependencies,0,(char *)0x0,
                               (ulong)installGens.
                                      super__Vector_base<cmInstallTargetGenerator_*,_std::allocator<cmInstallTargetGenerator_*>_>
                                      ._M_impl.super__Vector_impl_data._M_start);
        }
        else {
LAB_004c647d:
          puVar33 = (undefined8 *)
                    std::__cxx11::string::_M_append((char *)&installGens,dependencies.value_.uint_);
        }
        puVar1 = puVar33 + 2;
        if ((ulong *)*puVar33 == puVar1) {
          local_318._M_allocated_capacity = *puVar1;
          local_318._8_8_ = puVar33[3];
          __dnew = (size_type)&local_318;
        }
        else {
          local_318._M_allocated_capacity = *puVar1;
          __dnew = (size_type)*puVar33;
        }
        local_320 = (BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)puVar33[1];
        *puVar33 = puVar1;
        puVar33[1] = 0;
        *(undefined1 *)puVar1 = 0;
        cmSystemTools::RelativeIfUnder(&obj_dir,psVar28,(string *)&__dnew);
        Json::Value::Value(&launchers,&obj_dir);
        pVVar29 = Json::Value::operator[](&artifact,"path");
        Json::Value::operator=(pVVar29,&launchers);
        Json::Value::~Value(&launchers);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)obj_dir._M_dataplus._M_p != paVar73) {
          operator_delete(obj_dir._M_dataplus._M_p,obj_dir.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)__dnew != &local_318) {
          operator_delete((void *)__dnew,local_318._M_allocated_capacity + 1);
        }
        if (dependencies.value_ != &dependencies.comments_) {
          operator_delete(dependencies.value_.string_,
                          (long)dependencies.comments_.ptr_._M_t.
                                super___uniq_ptr_impl<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
                                .
                                super__Head_base<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_false>
                                ._M_head_impl + 1);
        }
        if (installGens.
            super__Vector_base<cmInstallTargetGenerator_*,_std::allocator<cmInstallTargetGenerator_*>_>
            ._M_impl.super__Vector_impl_data._M_start != (pointer)pppcVar3) {
          operator_delete(installGens.
                          super__Vector_base<cmInstallTargetGenerator_*,_std::allocator<cmInstallTargetGenerator_*>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (long)installGens.
                                super__Vector_base<cmInstallTargetGenerator_*,_std::allocator<cmInstallTargetGenerator_*>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage + 1);
        }
        Json::Value::append((Value *)&p,&artifact);
        Json::Value::~Value(&artifact);
      }
    }
    bVar24 = Json::Value::empty((Value *)&p);
    if (!bVar24) {
      pVVar29 = Json::Value::operator[](__return_storage_ptr__,"artifacts");
      Json::Value::operator=(pVVar29,(Value *)&p);
    }
    Json::Value::~Value((Value *)&p);
  }
  if (targetType - SHARED_LIBRARY < 2) {
LAB_004c662a:
    cmGeneratorTarget::GetFullName((string *)&launchers,this->GT,this->Config,RuntimeBinaryArtifact)
    ;
    Json::Value::Value(&artifact,(String *)&launchers);
    pVVar29 = Json::Value::operator[](__return_storage_ptr__,"nameOnDisk");
    Json::Value::operator=(pVVar29,&artifact);
    Json::Value::~Value(&artifact);
    if (launchers.value_ != &launchers.comments_) {
      operator_delete(launchers.value_.string_,
                      (long)launchers.comments_.ptr_._M_t.
                            super___uniq_ptr_impl<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
                            .
                            super__Head_base<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_false>
                            ._M_head_impl + 1);
    }
    Json::Value::Value(&launchers,objectValue);
    cmGeneratorTarget::GetLinkerLanguage(&p,this->GT,this->Config);
    Json::Value::Value(&artifact,&p);
    pVVar29 = Json::Value::operator[](&launchers,"language");
    Json::Value::operator=(pVVar29,&artifact);
    Json::Value::~Value(&artifact);
    DumpLinkCommandFragments(&artifact,this);
    bVar24 = Json::Value::empty(&artifact);
    if (!bVar24) {
      pVVar29 = Json::Value::operator[](&launchers,"commandFragments");
      Json::Value::operator=(pVVar29,&artifact);
    }
    Json::Value::~Value(&artifact);
    pcVar4 = this->GT->Makefile;
    pCVar59 = &artifact.comments_;
    obj_dir._M_dataplus._M_p = (pointer)0x12;
    artifact.value_ = (ValueHolder)pCVar59;
    artifact.value_.int_ = std::__cxx11::string::_M_create((ulong *)&artifact,(ulong)&obj_dir);
    artifact.comments_.ptr_._M_t.
    super___uniq_ptr_impl<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
    .
    super__Head_base<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_false>
    ._M_head_impl._0_4_ = (uint)obj_dir._M_dataplus._M_p;
    artifact.comments_.ptr_._M_t.
    super___uniq_ptr_impl<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
    .
    super__Head_base<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_false>
    ._M_head_impl._4_1_ = (undefined1)((ulong)obj_dir._M_dataplus._M_p >> 0x20);
    artifact.comments_.ptr_._M_t.
    super___uniq_ptr_impl<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
    .
    super__Head_base<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_false>
    ._M_head_impl._5_1_ = (undefined1)((ulong)obj_dir._M_dataplus._M_p >> 0x28);
    artifact.comments_.ptr_._M_t.
    super___uniq_ptr_impl<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
    .
    super__Head_base<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_false>
    ._M_head_impl._6_1_ = (undefined1)((ulong)obj_dir._M_dataplus._M_p >> 0x30);
    artifact.comments_.ptr_._M_t.
    super___uniq_ptr_impl<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
    .
    super__Head_base<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_false>
    ._M_head_impl._7_1_ = (undefined1)((ulong)obj_dir._M_dataplus._M_p >> 0x38);
    builtin_strncpy((char *)artifact.value_,"CMAKE_SY",8);
    *(undefined8 *)&((artifact.value_.map_)->_M_t)._M_impl.super__Rb_tree_header._M_header =
         0x494c5f544f4f5253;
    *(undefined2 *)&((artifact.value_.map_)->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent
         = 0x4b4e;
    artifact._8_8_ = obj_dir._M_dataplus._M_p;
    artifact.value_.string_[(long)obj_dir._M_dataplus._M_p] = '\0';
    cVar34 = cmMakefile::GetDefinition(pcVar4,(string *)&artifact);
    psVar31 = extraout_RDX;
    if (artifact.value_ != pCVar59) {
      operator_delete(artifact.value_.string_,
                      CONCAT17(artifact.comments_.ptr_._M_t.
                               super___uniq_ptr_impl<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
                               .
                               super__Head_base<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_false>
                               ._M_head_impl._7_1_,
                               CONCAT16(artifact.comments_.ptr_._M_t.
                                        super___uniq_ptr_impl<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
                                        ._M_t.
                                        super__Tuple_impl<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
                                        .
                                        super__Head_base<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_false>
                                        ._M_head_impl._6_1_,
                                        CONCAT15(artifact.comments_.ptr_._M_t.
                                                 super___uniq_ptr_impl<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
                                                 ._M_t.
                                                 super__Tuple_impl<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
                                                 .
                                                 super__Head_base<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_false>
                                                 ._M_head_impl._5_1_,
                                                 CONCAT14(artifact.comments_.ptr_._M_t.
                                                                                                                    
                                                  super___uniq_ptr_impl<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_false>
                                                  ._M_head_impl._4_1_,
                                                  (uint)artifact.comments_.ptr_._M_t.
                                                                                                                
                                                  super___uniq_ptr_impl<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_false>
                                                  ._M_head_impl)))) + 1);
      psVar31 = extraout_RDX_00;
    }
    if (cVar34.Value == (string *)0x0) {
      artifact.comments_.ptr_._M_t.
      super___uniq_ptr_impl<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
      .
      super__Head_base<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_false>
      ._M_head_impl._0_4_ = 0x4b414d43;
      artifact.comments_.ptr_._M_t.
      super___uniq_ptr_impl<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
      .
      super__Head_base<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_false>
      ._M_head_impl._4_1_ = 0x45;
      artifact.comments_.ptr_._M_t.
      super___uniq_ptr_impl<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
      .
      super__Head_base<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_false>
      ._M_head_impl._5_1_ = 0x5f;
      artifact.comments_.ptr_._M_t.
      super___uniq_ptr_impl<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
      .
      super__Head_base<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_false>
      ._M_head_impl._6_1_ = 0x53;
      artifact.comments_.ptr_._M_t.
      super___uniq_ptr_impl<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
      .
      super__Head_base<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_false>
      ._M_head_impl._7_1_ = 0x59;
      artifact.start_._0_5_ = 0x544f4f5253;
      artifact.bits_ = (anon_struct_4_2_14fb5ae2_for_bits_)0xd;
      artifact._12_4_ = 0;
      artifact.start_._5_1_ = 0;
      artifact.value_ = (ValueHolder)pCVar59;
      cVar34 = cmMakefile::GetDefinition(this->GT->Makefile,(string *)&artifact);
      psVar31 = extraout_RDX_01;
      if (artifact.value_ != pCVar59) {
        operator_delete(artifact.value_.string_,
                        CONCAT17(artifact.comments_.ptr_._M_t.
                                 super___uniq_ptr_impl<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
                                 .
                                 super__Head_base<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_false>
                                 ._M_head_impl._7_1_,
                                 CONCAT16(artifact.comments_.ptr_._M_t.
                                          super___uniq_ptr_impl<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
                                          ._M_t.
                                          super__Tuple_impl<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
                                          .
                                          super__Head_base<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_false>
                                          ._M_head_impl._6_1_,
                                          CONCAT15(artifact.comments_.ptr_._M_t.
                                                                                                      
                                                  super___uniq_ptr_impl<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_false>
                                                  ._M_head_impl._5_1_,
                                                  CONCAT14(artifact.comments_.ptr_._M_t.
                                                                                                                      
                                                  super___uniq_ptr_impl<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_false>
                                                  ._M_head_impl._4_1_,
                                                  (uint)artifact.comments_.ptr_._M_t.
                                                                                                                
                                                  super___uniq_ptr_impl<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_false>
                                                  ._M_head_impl)))) + 1);
        psVar31 = extraout_RDX_02;
      }
      if (cVar34.Value != (string *)0x0) {
        DumpSysroot(&artifact,(Target *)cVar34.Value,psVar31);
        pVVar29 = Json::Value::operator[](&launchers,"sysroot");
        goto LAB_004c68b3;
      }
    }
    else {
      DumpSysroot(&artifact,(Target *)cVar34.Value,psVar31);
      pVVar29 = Json::Value::operator[](&launchers,"sysroot");
LAB_004c68b3:
      Json::Value::operator=(pVVar29,&artifact);
      Json::Value::~Value(&artifact);
    }
    bVar24 = cmGeneratorTarget::IsIPOEnabled(this->GT,&p,this->Config);
    if (bVar24) {
      Json::Value::Value(&artifact,true);
      pVVar29 = Json::Value::operator[](&launchers,"lto");
      Json::Value::operator=(pVVar29,&artifact);
      Json::Value::~Value(&artifact);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)p._M_dataplus._M_p != &p.field_2) {
      operator_delete(p._M_dataplus._M_p,p.field_2._M_allocated_capacity + 1);
    }
    pVVar29 = Json::Value::operator[](__return_storage_ptr__,"link");
  }
  else {
    if (targetType != STATIC_LIBRARY) {
      if (targetType != EXECUTABLE) goto LAB_004c6c81;
      goto LAB_004c662a;
    }
    cmGeneratorTarget::GetFullName((string *)&launchers,this->GT,this->Config,RuntimeBinaryArtifact)
    ;
    Json::Value::Value(&artifact,(String *)&launchers);
    pVVar29 = Json::Value::operator[](__return_storage_ptr__,"nameOnDisk");
    Json::Value::operator=(pVVar29,&artifact);
    Json::Value::~Value(&artifact);
    if (launchers.value_ != &launchers.comments_) {
      operator_delete(launchers.value_.string_,
                      (long)launchers.comments_.ptr_._M_t.
                            super___uniq_ptr_impl<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
                            .
                            super__Head_base<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_false>
                            ._M_head_impl + 1);
    }
    Json::Value::Value(&launchers,objectValue);
    DumpLinkCommandFragments(&artifact,this);
    bVar24 = Json::Value::empty(&artifact);
    if (!bVar24) {
      pVVar29 = Json::Value::operator[](&launchers,"commandFragments");
      Json::Value::operator=(pVVar29,&artifact);
    }
    Json::Value::~Value(&artifact);
    cmGeneratorTarget::GetLinkerLanguage(&p,this->GT,this->Config);
    bVar24 = cmGeneratorTarget::IsIPOEnabled(this->GT,&p,this->Config);
    if (bVar24) {
      Json::Value::Value(&artifact,true);
      pVVar29 = Json::Value::operator[](&launchers,"lto");
      Json::Value::operator=(pVVar29,&artifact);
      Json::Value::~Value(&artifact);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)p._M_dataplus._M_p != &p.field_2) {
      operator_delete(p._M_dataplus._M_p,p.field_2._M_allocated_capacity + 1);
    }
    pVVar29 = Json::Value::operator[](__return_storage_ptr__,"archive");
  }
  Json::Value::operator=(pVVar29,&launchers);
  Json::Value::~Value(&launchers);
  if (targetType == EXECUTABLE) {
    Json::Value::Value(&launchers,nullValue);
    DumpLauncher(&artifact,this,"TEST_LAUNCHER","test");
    bVar24 = Json::Value::empty(&artifact);
    if (!bVar24) {
      Json::Value::append(&launchers,&artifact);
    }
    Json::Value::~Value(&artifact);
    pcVar4 = this->GT->Makefile;
    p._M_dataplus._M_p = (pointer)0x14;
    artifact.value_ = (ValueHolder)&artifact.comments_;
    artifact.value_.int_ = std::__cxx11::string::_M_create((ulong *)&artifact,(ulong)&p);
    artifact.comments_.ptr_._M_t.
    super___uniq_ptr_impl<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
    .
    super__Head_base<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_false>
    ._M_head_impl._0_4_ = (uint)p._M_dataplus._M_p;
    artifact.comments_.ptr_._M_t.
    super___uniq_ptr_impl<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
    .
    super__Head_base<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_false>
    ._M_head_impl._4_1_ = (undefined1)((ulong)p._M_dataplus._M_p >> 0x20);
    artifact.comments_.ptr_._M_t.
    super___uniq_ptr_impl<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
    .
    super__Head_base<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_false>
    ._M_head_impl._5_1_ = (undefined1)((ulong)p._M_dataplus._M_p >> 0x28);
    artifact.comments_.ptr_._M_t.
    super___uniq_ptr_impl<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
    .
    super__Head_base<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_false>
    ._M_head_impl._6_1_ = (undefined1)((ulong)p._M_dataplus._M_p >> 0x30);
    artifact.comments_.ptr_._M_t.
    super___uniq_ptr_impl<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
    .
    super__Head_base<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_false>
    ._M_head_impl._7_1_ = (undefined1)((ulong)p._M_dataplus._M_p >> 0x38);
    builtin_strncpy((char *)artifact.value_,"CMAKE_CR",8);
    *(undefined8 *)&((artifact.value_.map_)->_M_t)._M_impl.super__Rb_tree_header._M_header =
         0x49504d4f4353534f;
    *(undefined4 *)&((artifact.value_.map_)->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent
         = 0x474e494c;
    artifact._8_8_ = p._M_dataplus._M_p;
    artifact.value_.string_[(long)p._M_dataplus._M_p] = '\0';
    bVar24 = cmMakefile::IsOn(pcVar4,(string *)&artifact);
    if (artifact.value_ != &artifact.comments_) {
      operator_delete(artifact.value_.string_,
                      CONCAT17(artifact.comments_.ptr_._M_t.
                               super___uniq_ptr_impl<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
                               .
                               super__Head_base<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_false>
                               ._M_head_impl._7_1_,
                               CONCAT16(artifact.comments_.ptr_._M_t.
                                        super___uniq_ptr_impl<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
                                        ._M_t.
                                        super__Tuple_impl<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
                                        .
                                        super__Head_base<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_false>
                                        ._M_head_impl._6_1_,
                                        CONCAT15(artifact.comments_.ptr_._M_t.
                                                 super___uniq_ptr_impl<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
                                                 ._M_t.
                                                 super__Tuple_impl<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
                                                 .
                                                 super__Head_base<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_false>
                                                 ._M_head_impl._5_1_,
                                                 CONCAT14(artifact.comments_.ptr_._M_t.
                                                                                                                    
                                                  super___uniq_ptr_impl<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_false>
                                                  ._M_head_impl._4_1_,
                                                  (uint)artifact.comments_.ptr_._M_t.
                                                                                                                
                                                  super___uniq_ptr_impl<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_false>
                                                  ._M_head_impl)))) + 1);
    }
    if (bVar24) {
      DumpLauncher(&artifact,this,"CROSSCOMPILING_EMULATOR","emulator");
      bVar24 = Json::Value::empty(&artifact);
      if (!bVar24) {
        Json::Value::append(&launchers,&artifact);
      }
      Json::Value::~Value(&artifact);
    }
    bVar24 = Json::Value::empty(&launchers);
    if (!bVar24) {
      pVVar29 = Json::Value::operator[](__return_storage_ptr__,"launchers");
      Json::Value::operator=(pVVar29,&launchers);
    }
    Json::Value::~Value(&launchers);
  }
LAB_004c6c81:
  Json::Value::Value(&dependencies,arrayValue);
  this_01 = cmGeneratorTarget::GetGlobalGenerator(this->GT);
  pTVar35 = cmGlobalGenerator::GetTargetDirectDepends(this_01,this->GT);
  p_Var36 = (pTVar35->
            super_set<cmTargetDepend,_std::less<cmTargetDepend>,_std::allocator<cmTargetDepend>_>).
            _M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var52 = &(pTVar35->
             super_set<cmTargetDepend,_std::less<cmTargetDepend>,_std::allocator<cmTargetDepend>_>).
             _M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)p_Var36 != p_Var52) {
    do {
      Json::Value::Value(&launchers,objectValue);
      TargetId(&p,*(cmGeneratorTarget **)(p_Var36 + 1),psVar28);
      Json::Value::Value(&artifact,&p);
      pVVar29 = Json::Value::operator[](&launchers,"id");
      Json::Value::operator=(pVVar29,&artifact);
      Json::Value::~Value(&artifact);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)p._M_dataplus._M_p != &p.field_2) {
        operator_delete(p._M_dataplus._M_p,p.field_2._M_allocated_capacity + 1);
      }
      AddBacktrace(this,&launchers,(cmListFileBacktrace *)&p_Var36[1]._M_left);
      Json::Value::append(&dependencies,&launchers);
      Json::Value::~Value(&launchers);
      p_Var36 = (_Base_ptr)std::_Rb_tree_increment(p_Var36);
    } while ((_Rb_tree_header *)p_Var36 != p_Var52);
  }
  bVar24 = Json::Value::empty(&dependencies);
  if (!bVar24) {
    pVVar29 = Json::Value::operator[](__return_storage_ptr__,"dependencies");
    Json::Value::operator=(pVVar29,&dependencies);
  }
  p._M_string_length = (ulong)p._M_string_length._4_4_ << 0x20;
  p.field_2._M_allocated_capacity = 0;
  p.field_2._8_8_ = &p._M_string_length;
  cmGeneratorTarget::GetLanguages
            (this->GT,(set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&p,this->Config);
  if ((size_type *)p.field_2._8_8_ != &p._M_string_length) {
    local_208 = (pointer)&this->CompileDataMap;
    local_140._M_nxt = (_Hash_node_base *)&(this->CompileDataMap)._M_t._M_impl.super__Rb_tree_header
    ;
    local_130 = &this->Backtraces;
    uVar43 = p.field_2._8_8_;
    do {
      __x_00 = (_Rb_tree_node_base *)(uVar43 + 0x20);
      local_128 = (_Rb_tree_node_base *)uVar43;
      iVar37 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CompileData,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CompileData>_>_>
               ::lower_bound((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CompileData,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CompileData>_>_>
                              *)local_208,(key_type *)__x_00);
      if ((iVar37._M_node == (_Base_ptr)local_140._M_nxt) ||
         (iVar26 = std::__cxx11::string::compare((string *)__x_00), iVar26 < 0)) {
        p_Var38 = (_Rb_tree_node_base *)operator_new(0x130);
        __k = (_Link_type)(p_Var38 + 1);
        *(_Base_ptr **)(p_Var38 + 1) = &p_Var38[1]._M_left;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)__k,*(long *)(local_128 + 1),
                   (long)&(local_128[1]._M_parent)->_M_color + *(long *)(local_128 + 1));
        memset(p_Var38 + 2,0,0xf0);
        *(_Base_ptr **)(p_Var38 + 2) = &p_Var38[2]._M_left;
        p_Var38[2]._M_parent = (_Base_ptr)0x0;
        *(undefined1 *)&p_Var38[2]._M_left = 0;
        *(_Base_ptr **)(p_Var38 + 3) = &p_Var38[3]._M_left;
        p_Var38[3]._M_parent = (_Base_ptr)0x0;
        *(undefined1 *)&p_Var38[3]._M_left = 0;
        uVar15 = (uint)artifact.comments_.ptr_._M_t.
                       super___uniq_ptr_impl<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
                       .
                       super__Head_base<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_false>
                       ._M_head_impl >> 8;
        artifact.comments_.ptr_._M_t.
        super___uniq_ptr_impl<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
        .
        super__Head_base<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_false>
        ._M_head_impl._0_4_ = uVar15 << 8;
        *(_Base_ptr **)(p_Var38 + 4) = &p_Var38[4]._M_left;
        p_Var38[4]._M_left =
             (_Base_ptr)
             CONCAT17(artifact.comments_.ptr_._M_t.
                      super___uniq_ptr_impl<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
                      .
                      super__Head_base<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_false>
                      ._M_head_impl._7_1_,
                      CONCAT16(artifact.comments_.ptr_._M_t.
                               super___uniq_ptr_impl<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
                               .
                               super__Head_base<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_false>
                               ._M_head_impl._6_1_,
                               CONCAT15(artifact.comments_.ptr_._M_t.
                                        super___uniq_ptr_impl<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
                                        ._M_t.
                                        super__Tuple_impl<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
                                        .
                                        super__Head_base<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_false>
                                        ._M_head_impl._5_1_,
                                        CONCAT14(artifact.comments_.ptr_._M_t.
                                                 super___uniq_ptr_impl<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
                                                 ._M_t.
                                                 super__Tuple_impl<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
                                                 .
                                                 super__Head_base<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_false>
                                                 ._M_head_impl._4_1_,
                                                 (uint)artifact.comments_.ptr_._M_t.
                                                                                                              
                                                  super___uniq_ptr_impl<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_false>
                                                  ._M_head_impl))));
        p_Var38[4]._M_right =
             (_Base_ptr)
             CONCAT26(artifact.start_._6_2_,
                      CONCAT15(artifact.start_._5_1_,(undefined5)artifact.start_));
        p_Var38[4]._M_parent = (_Base_ptr)0x0;
        artifact.bits_ = (anon_struct_4_2_14fb5ae2_for_bits_)0x0;
        artifact._12_4_ = 0;
        artifact.comments_.ptr_._M_t.
        super___uniq_ptr_impl<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
        .
        super__Head_base<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_false>
        ._M_head_impl._0_4_ = uVar15 << 8;
        artifact.value_ = (ValueHolder)&artifact.comments_;
        memset(p_Var38 + 5,0,0x90);
        if (iVar37._M_node == (_Base_ptr)local_140._M_nxt) {
          if (((this->CompileDataMap)._M_t._M_impl.super__Rb_tree_header._M_node_count == 0) ||
             (__p = __k,
             iVar26 = std::__cxx11::string::compare
                                ((string *)
                                 ((this->CompileDataMap)._M_t._M_impl.super__Rb_tree_header.
                                  _M_header._M_right + 1)), -1 < iVar26)) {
LAB_004c7000:
            __p = __k;
            pVar75 = std::
                     _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CompileData>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CompileData>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CompileData>_>_>
                     ::_M_get_insert_unique_pos
                               ((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CompileData>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CompileData>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CompileData>_>_>
                                 *)local_208,(key_type *)__k);
          }
          else {
            p_Var70 = (this->CompileDataMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_right;
LAB_004c7024:
            auVar14._8_8_ = 0;
            auVar14._0_8_ = p_Var70;
            pVar75 = (pair<std::_Rb_tree_node_base_*,_std::_Rb_tree_node_base_*>)(auVar14 << 0x40);
          }
        }
        else {
          __p = (_Link_type)(iVar37._M_node + 1);
          iVar26 = std::__cxx11::string::compare((string *)__k);
          if (iVar26 < 0) {
            p_Var70 = (this->CompileDataMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
            pVar75.second = p_Var70;
            pVar75.first = p_Var70;
            if (p_Var70 != iVar37._M_node) {
              p_Var70 = (_Base_ptr)std::_Rb_tree_decrement(iVar37._M_node);
              __p = __k;
              iVar26 = std::__cxx11::string::compare((string *)(p_Var70 + 1));
              if (-1 < iVar26) goto LAB_004c7000;
              iVar58 = iVar37;
              if (p_Var70->_M_right == (_Base_ptr)0x0) {
                iVar58._M_node = (_Base_ptr)0x0;
                iVar37._M_node = p_Var70;
              }
LAB_004c7048:
              pVar75.second = iVar37._M_node;
              pVar75.first = iVar58._M_node;
            }
          }
          else {
            __p = __k;
            iVar26 = std::__cxx11::string::compare((string *)(iVar37._M_node + 1));
            if (iVar26 < 0) {
              p_Var70 = (this->CompileDataMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_right
              ;
              if (p_Var70 == iVar37._M_node) goto LAB_004c7024;
              p_Var70 = (_Base_ptr)std::_Rb_tree_increment(iVar37._M_node);
              __p = (_Link_type)(p_Var70 + 1);
              iVar26 = std::__cxx11::string::compare((string *)__k);
              if (iVar26 < 0) {
                iVar58._M_node = (iVar37._M_node)->_M_right;
                if ((iVar37._M_node)->_M_right != (_Base_ptr)0x0) {
                  iVar58._M_node = p_Var70;
                  iVar37._M_node = p_Var70;
                }
                goto LAB_004c7048;
              }
              goto LAB_004c7000;
            }
            pVar75.second = (_Rb_tree_node_base *)0x0;
            pVar75.first = iVar37._M_node;
          }
        }
        p_Var68 = pVar75.second;
        iVar37._M_node = pVar75.first;
        if (p_Var68 == (_Rb_tree_node_base *)0x0) {
          std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CompileData>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CompileData>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CompileData>_>_>
          ::_M_drop_node((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CompileData>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CompileData>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CompileData>_>_>
                          *)p_Var38,__p);
        }
        else {
          bVar24 = true;
          if ((iVar37._M_node == (_Base_ptr)0x0) &&
             ((_Rb_tree_node_base *)local_140._M_nxt != p_Var68)) {
            std::__cxx11::string::compare((string *)__k);
            bVar24 = (bool)(extraout_var >> 7);
          }
          std::_Rb_tree_insert_and_rebalance
                    (bVar24,p_Var38,p_Var68,(_Rb_tree_node_base *)local_140._M_nxt);
          psVar2 = &(this->CompileDataMap)._M_t._M_impl.super__Rb_tree_header._M_node_count;
          *psVar2 = *psVar2 + 1;
          iVar37._M_node = p_Var38;
        }
      }
      pCVar59 = &artifact.comments_;
      std::__cxx11::string::_M_assign((string *)(iVar37._M_node + 2));
      pcVar4 = this->GT->Makefile;
      launchers.value_.int_ = 0x15;
      artifact.value_ = (ValueHolder)pCVar59;
      artifact.value_.int_ = std::__cxx11::string::_M_create((ulong *)&artifact,(ulong)&launchers);
      artifact.comments_.ptr_._M_t.
      super___uniq_ptr_impl<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
      .
      super__Head_base<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_false>
      ._M_head_impl._0_4_ = (uint)launchers.value_.int_;
      artifact.comments_.ptr_._M_t.
      super___uniq_ptr_impl<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
      .
      super__Head_base<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_false>
      ._M_head_impl._4_1_ = (undefined1)((ulong)launchers.value_ >> 0x20);
      artifact.comments_.ptr_._M_t.
      super___uniq_ptr_impl<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
      .
      super__Head_base<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_false>
      ._M_head_impl._5_1_ = (undefined1)((ulong)launchers.value_ >> 0x28);
      artifact.comments_.ptr_._M_t.
      super___uniq_ptr_impl<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
      .
      super__Head_base<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_false>
      ._M_head_impl._6_1_ = (undefined1)((ulong)launchers.value_ >> 0x30);
      artifact.comments_.ptr_._M_t.
      super___uniq_ptr_impl<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
      .
      super__Head_base<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_false>
      ._M_head_impl._7_1_ = (undefined1)((ulong)launchers.value_ >> 0x38);
      builtin_strncpy((char *)artifact.value_,"CMAKE_SY",8);
      *(undefined8 *)&((artifact.value_.map_)->_M_t)._M_impl.super__Rb_tree_header._M_header =
           0x4f435f544f4f5253;
      *(undefined8 *)
       &((artifact.value_.map_)->_M_t)._M_impl.super__Rb_tree_header._M_header.field_0x5 =
           0x454c49504d4f435f;
      artifact._8_8_ = launchers.value_;
      artifact.value_.string_[launchers.value_.string_] = '\0';
      cVar34 = cmMakefile::GetDefinition(pcVar4,(string *)&artifact);
      if (artifact.value_ != pCVar59) {
        operator_delete(artifact.value_.string_,
                        CONCAT17(artifact.comments_.ptr_._M_t.
                                 super___uniq_ptr_impl<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
                                 .
                                 super__Head_base<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_false>
                                 ._M_head_impl._7_1_,
                                 CONCAT16(artifact.comments_.ptr_._M_t.
                                          super___uniq_ptr_impl<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
                                          ._M_t.
                                          super__Tuple_impl<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
                                          .
                                          super__Head_base<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_false>
                                          ._M_head_impl._6_1_,
                                          CONCAT15(artifact.comments_.ptr_._M_t.
                                                                                                      
                                                  super___uniq_ptr_impl<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_false>
                                                  ._M_head_impl._5_1_,
                                                  CONCAT14(artifact.comments_.ptr_._M_t.
                                                                                                                      
                                                  super___uniq_ptr_impl<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_false>
                                                  ._M_head_impl._4_1_,
                                                  (uint)artifact.comments_.ptr_._M_t.
                                                                                                                
                                                  super___uniq_ptr_impl<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_false>
                                                  ._M_head_impl)))) + 1);
      }
      if (cVar34.Value == (string *)0x0) {
        artifact.start_._0_5_ = 0x544f4f5253;
        artifact.comments_.ptr_._M_t.
        super___uniq_ptr_impl<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
        .
        super__Head_base<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_false>
        ._M_head_impl._0_4_ = 0x4b414d43;
        artifact.comments_.ptr_._M_t.
        super___uniq_ptr_impl<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
        .
        super__Head_base<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_false>
        ._M_head_impl._4_1_ = 0x45;
        artifact.comments_.ptr_._M_t.
        super___uniq_ptr_impl<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
        .
        super__Head_base<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_false>
        ._M_head_impl._5_1_ = 0x5f;
        artifact.comments_.ptr_._M_t.
        super___uniq_ptr_impl<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
        .
        super__Head_base<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_false>
        ._M_head_impl._6_1_ = 0x53;
        artifact.comments_.ptr_._M_t.
        super___uniq_ptr_impl<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
        .
        super__Head_base<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_false>
        ._M_head_impl._7_1_ = 0x59;
        artifact.bits_ = (anon_struct_4_2_14fb5ae2_for_bits_)0xd;
        artifact._12_4_ = 0;
        artifact.start_._5_1_ = 0;
        artifact.value_ = (ValueHolder)pCVar59;
        cVar34 = cmMakefile::GetDefinition(this->GT->Makefile,(string *)&artifact);
        if (artifact.value_ != pCVar59) {
          operator_delete(artifact.value_.string_,
                          CONCAT17(artifact.comments_.ptr_._M_t.
                                   super___uniq_ptr_impl<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
                                   .
                                   super__Head_base<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_false>
                                   ._M_head_impl._7_1_,
                                   CONCAT16(artifact.comments_.ptr_._M_t.
                                            super___uniq_ptr_impl<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
                                            ._M_t.
                                            super__Tuple_impl<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
                                            .
                                            super__Head_base<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_false>
                                            ._M_head_impl._6_1_,
                                            CONCAT15(artifact.comments_.ptr_._M_t.
                                                                                                          
                                                  super___uniq_ptr_impl<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_false>
                                                  ._M_head_impl._5_1_,
                                                  CONCAT14(artifact.comments_.ptr_._M_t.
                                                                                                                      
                                                  super___uniq_ptr_impl<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_false>
                                                  ._M_head_impl._4_1_,
                                                  (uint)artifact.comments_.ptr_._M_t.
                                                                                                                
                                                  super___uniq_ptr_impl<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_false>
                                                  ._M_head_impl)))) + 1);
        }
        if (cVar34.Value != (string *)0x0) goto LAB_004c71ef;
      }
      else {
LAB_004c71ef:
        std::__cxx11::string::_M_assign((string *)(iVar37._M_node + 3));
      }
      pcVar30 = cmGeneratorTarget::GetLocalGenerator(this->GT);
      artifact.bits_ = (anon_struct_4_2_14fb5ae2_for_bits_)0x0;
      artifact._12_4_ = 0;
      artifact.comments_.ptr_._M_t.
      super___uniq_ptr_impl<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
      .
      super__Head_base<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_false>
      ._M_head_impl._0_4_ =
           (uint)artifact.comments_.ptr_._M_t.
                 super___uniq_ptr_impl<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
                 .
                 super__Head_base<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_false>
                 ._M_head_impl & 0xffffff00;
      artifact.value_ = (ValueHolder)pCVar59;
      cmLocalGenerator::GetTargetCompileFlags
                ((vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)&launchers,pcVar30,this->GT,this->Config,(string *)__x_00,(string *)&artifact);
      if (artifact.value_ != pCVar59) {
        operator_delete(artifact.value_.string_,
                        CONCAT17(artifact.comments_.ptr_._M_t.
                                 super___uniq_ptr_impl<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
                                 .
                                 super__Head_base<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_false>
                                 ._M_head_impl._7_1_,
                                 CONCAT16(artifact.comments_.ptr_._M_t.
                                          super___uniq_ptr_impl<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
                                          ._M_t.
                                          super__Tuple_impl<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
                                          .
                                          super__Head_base<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_false>
                                          ._M_head_impl._6_1_,
                                          CONCAT15(artifact.comments_.ptr_._M_t.
                                                                                                      
                                                  super___uniq_ptr_impl<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_false>
                                                  ._M_head_impl._5_1_,
                                                  CONCAT14(artifact.comments_.ptr_._M_t.
                                                                                                                      
                                                  super___uniq_ptr_impl<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_false>
                                                  ._M_head_impl._4_1_,
                                                  (uint)artifact.comments_.ptr_._M_t.
                                                                                                                
                                                  super___uniq_ptr_impl<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_false>
                                                  ._M_head_impl)))) + 1);
      }
      std::
      vector<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::reserve((vector<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 *)&iVar37._M_node[5]._M_right,
                (launchers._8_8_ - (long)launchers.value_ >> 4) * -0x5555555555555555);
      uVar43 = launchers._8_8_;
      for (VVar66 = launchers.value_; VVar66.int_ != uVar43;
          VVar66.string_ = (char *)(VVar66.int_ + 0x30)) {
        (anonymous_namespace)::Target::ToJBT<std::__cxx11::string>
                  ((JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&artifact,this,
                   (BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)VVar66.map_);
        std::
        vector<(anonymous_namespace)::JBT<std::__cxx11::string>,std::allocator<(anonymous_namespace)::JBT<std::__cxx11::string>>>
        ::emplace_back<(anonymous_namespace)::JBT<std::__cxx11::string>>
                  ((vector<(anonymous_namespace)::JBT<std::__cxx11::string>,std::allocator<(anonymous_namespace)::JBT<std::__cxx11::string>>>
                    *)&iVar37._M_node[5]._M_right,
                   (JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&artifact);
        if (artifact.value_ != pCVar59) {
          operator_delete(artifact.value_.string_,
                          CONCAT17(artifact.comments_.ptr_._M_t.
                                   super___uniq_ptr_impl<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
                                   .
                                   super__Head_base<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_false>
                                   ._M_head_impl._7_1_,
                                   CONCAT16(artifact.comments_.ptr_._M_t.
                                            super___uniq_ptr_impl<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
                                            ._M_t.
                                            super__Tuple_impl<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
                                            .
                                            super__Head_base<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_false>
                                            ._M_head_impl._6_1_,
                                            CONCAT15(artifact.comments_.ptr_._M_t.
                                                                                                          
                                                  super___uniq_ptr_impl<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_false>
                                                  ._M_head_impl._5_1_,
                                                  CONCAT14(artifact.comments_.ptr_._M_t.
                                                                                                                      
                                                  super___uniq_ptr_impl<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_false>
                                                  ._M_head_impl._4_1_,
                                                  (uint)artifact.comments_.ptr_._M_t.
                                                                                                                
                                                  super___uniq_ptr_impl<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_false>
                                                  ._M_head_impl)))) + 1);
        }
      }
      std::
      vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~vector((vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 *)&launchers);
      cmLocalGenerator::GetTargetDefines
                ((set<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)&launchers,pcVar30,this->GT,this->Config,(string *)__x_00);
      std::
      vector<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::reserve((vector<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 *)&iVar37._M_node[6]._M_left,(size_type)local_170[0]);
      for (p_Var38 = (_Rb_tree_node_base *)launchers.start_;
          p_Var38 != (_Rb_tree_node_base *)&launchers.bits_;
          p_Var38 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var38)) {
        (anonymous_namespace)::Target::ToJBT<std::__cxx11::string>
                  ((JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&artifact,this,
                   (BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)(p_Var38 + 1));
        std::
        vector<(anonymous_namespace)::JBT<std::__cxx11::string>,std::allocator<(anonymous_namespace)::JBT<std::__cxx11::string>>>
        ::emplace_back<(anonymous_namespace)::JBT<std::__cxx11::string>>
                  ((vector<(anonymous_namespace)::JBT<std::__cxx11::string>,std::allocator<(anonymous_namespace)::JBT<std::__cxx11::string>>>
                    *)&iVar37._M_node[6]._M_left,
                   (JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&artifact);
        if (artifact.value_ != pCVar59) {
          operator_delete(artifact.value_.string_,
                          CONCAT17(artifact.comments_.ptr_._M_t.
                                   super___uniq_ptr_impl<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
                                   .
                                   super__Head_base<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_false>
                                   ._M_head_impl._7_1_,
                                   CONCAT16(artifact.comments_.ptr_._M_t.
                                            super___uniq_ptr_impl<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
                                            ._M_t.
                                            super__Tuple_impl<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
                                            .
                                            super__Head_base<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_false>
                                            ._M_head_impl._6_1_,
                                            CONCAT15(artifact.comments_.ptr_._M_t.
                                                                                                          
                                                  super___uniq_ptr_impl<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_false>
                                                  ._M_head_impl._5_1_,
                                                  CONCAT14(artifact.comments_.ptr_._M_t.
                                                                                                                      
                                                  super___uniq_ptr_impl<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_false>
                                                  ._M_head_impl._4_1_,
                                                  (uint)artifact.comments_.ptr_._M_t.
                                                                                                                
                                                  super___uniq_ptr_impl<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_false>
                                                  ._M_head_impl)))) + 1);
        }
      }
      cmLocalGenerator::GetIncludeDirectories
                ((vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)&__dnew,pcVar30,this->GT,(string *)__x_00,this->Config);
      pBVar69 = local_320;
      if ((BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *)
          __dnew != local_320) {
        bt_02 = (BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)__dnew;
        do {
          bVar24 = cmGeneratorTarget::IsApple(this->GT);
          if ((bVar24) && (bVar24 = cmSystemTools::IsPathToFramework(&bt_02->Value), bVar24)) {
            (anonymous_namespace)::Target::ToJBT<std::__cxx11::string>
                      ((JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&artifact,this,bt_02);
            bVar24 = cmGeneratorTarget::IsSystemIncludeDirectory
                               (this->GT,&bt_02->Value,this->Config,(string *)__x_00);
            obj_dir._M_dataplus._M_p._0_1_ = bVar24;
            std::
            vector<(anonymous_namespace)::CompileData::IncludeEntry,std::allocator<(anonymous_namespace)::CompileData::IncludeEntry>>
            ::emplace_back<(anonymous_namespace)::JBT<std::__cxx11::string>,bool>
                      ((vector<(anonymous_namespace)::CompileData::IncludeEntry,std::allocator<(anonymous_namespace)::CompileData::IncludeEntry>>
                        *)&iVar37._M_node[8]._M_right,
                       (JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&artifact,(bool *)&obj_dir);
          }
          else {
            (anonymous_namespace)::Target::ToJBT<std::__cxx11::string>
                      ((JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&artifact,this,bt_02);
            bVar24 = cmGeneratorTarget::IsSystemIncludeDirectory
                               (this->GT,&bt_02->Value,this->Config,(string *)__x_00);
            obj_dir._M_dataplus._M_p._0_1_ = bVar24;
            std::
            vector<(anonymous_namespace)::CompileData::IncludeEntry,std::allocator<(anonymous_namespace)::CompileData::IncludeEntry>>
            ::emplace_back<(anonymous_namespace)::JBT<std::__cxx11::string>,bool>
                      ((vector<(anonymous_namespace)::CompileData::IncludeEntry,std::allocator<(anonymous_namespace)::CompileData::IncludeEntry>>
                        *)(iVar37._M_node + 8),
                       (JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&artifact,(bool *)&obj_dir);
          }
          if (artifact.value_ != &artifact.comments_) {
            operator_delete(artifact.value_.string_,
                            CONCAT17(artifact.comments_.ptr_._M_t.
                                     super___uniq_ptr_impl<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
                                     .
                                     super__Head_base<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_false>
                                     ._M_head_impl._7_1_,
                                     CONCAT16(artifact.comments_.ptr_._M_t.
                                              super___uniq_ptr_impl<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
                                              ._M_t.
                                              super__Tuple_impl<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
                                              .
                                              super__Head_base<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_false>
                                              ._M_head_impl._6_1_,
                                              CONCAT15(artifact.comments_.ptr_._M_t.
                                                                                                              
                                                  super___uniq_ptr_impl<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_false>
                                                  ._M_head_impl._5_1_,
                                                  CONCAT14(artifact.comments_.ptr_._M_t.
                                                                                                                      
                                                  super___uniq_ptr_impl<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_false>
                                                  ._M_head_impl._4_1_,
                                                  (uint)artifact.comments_.ptr_._M_t.
                                                                                                                
                                                  super___uniq_ptr_impl<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_false>
                                                  ._M_head_impl)))) + 1);
          }
          bt_02 = bt_02 + 1;
        } while (bt_02 != pBVar69);
      }
      cmGeneratorTarget::GetPrecompileHeaders
                ((vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)&installGens,this->GT,this->Config,(string *)__x_00);
      ppcVar21 = installGens.
                 super__Vector_base<cmInstallTargetGenerator_*,_std::allocator<cmInstallTargetGenerator_*>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      if (installGens.
          super__Vector_base<cmInstallTargetGenerator_*,_std::allocator<cmInstallTargetGenerator_*>_>
          ._M_impl.super__Vector_impl_data._M_start !=
          installGens.
          super__Vector_base<cmInstallTargetGenerator_*,_std::allocator<cmInstallTargetGenerator_*>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        pBVar69 = (BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)installGens.
                     super__Vector_base<cmInstallTargetGenerator_*,_std::allocator<cmInstallTargetGenerator_*>_>
                     ._M_impl.super__Vector_impl_data._M_start;
        do {
          (anonymous_namespace)::Target::ToJBT<std::__cxx11::string>
                    ((JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&artifact,this,pBVar69);
          std::
          vector<(anonymous_namespace)::JBT<std::__cxx11::string>,std::allocator<(anonymous_namespace)::JBT<std::__cxx11::string>>>
          ::emplace_back<(anonymous_namespace)::JBT<std::__cxx11::string>>
                    ((vector<(anonymous_namespace)::JBT<std::__cxx11::string>,std::allocator<(anonymous_namespace)::JBT<std::__cxx11::string>>>
                      *)&iVar37._M_node[7]._M_parent,
                     (JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&artifact);
          if (artifact.value_ != &artifact.comments_) {
            operator_delete(artifact.value_.string_,
                            CONCAT17(artifact.comments_.ptr_._M_t.
                                     super___uniq_ptr_impl<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
                                     .
                                     super__Head_base<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_false>
                                     ._M_head_impl._7_1_,
                                     CONCAT16(artifact.comments_.ptr_._M_t.
                                              super___uniq_ptr_impl<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
                                              ._M_t.
                                              super__Tuple_impl<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
                                              .
                                              super__Head_base<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_false>
                                              ._M_head_impl._6_1_,
                                              CONCAT15(artifact.comments_.ptr_._M_t.
                                                                                                              
                                                  super___uniq_ptr_impl<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_false>
                                                  ._M_head_impl._5_1_,
                                                  CONCAT14(artifact.comments_.ptr_._M_t.
                                                                                                                      
                                                  super___uniq_ptr_impl<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_false>
                                                  ._M_head_impl._4_1_,
                                                  (uint)artifact.comments_.ptr_._M_t.
                                                                                                                
                                                  super___uniq_ptr_impl<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_false>
                                                  ._M_head_impl)))) + 1);
          }
          pBVar69 = pBVar69 + 1;
        } while (pBVar69 !=
                 (BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)ppcVar21);
      }
      pBVar39 = cmGeneratorTarget::GetLanguageStandardProperty
                          (this->GT,(string *)__x_00,this->Config);
      if (pBVar39 !=
          (BTs<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *)
          0x0) {
        pcVar5 = (pBVar39->Backtraces).
                 super__Vector_base<cmListFileBacktrace,_std::allocator<cmListFileBacktrace>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        pcVar6 = (pBVar39->Backtraces).
                 super__Vector_base<cmListFileBacktrace,_std::allocator<cmListFileBacktrace>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
        p_Var53 = (_Vector_base<(anonymous_namespace)::JBTIndex,_std::allocator<(anonymous_namespace)::JBTIndex>_>
                   *)((long)pcVar6 - (long)pcVar5 >> 4);
        if ((_Vector_base<(anonymous_namespace)::JBTIndex,_std::allocator<(anonymous_namespace)::JBTIndex>_>
             *)0x1fffffffffffffff < p_Var53) {
          std::__throw_length_error("vector::reserve");
        }
        if (pcVar6 == pcVar5) {
          pJVar40 = (pointer)0x0;
          local_378 = (pointer)0x0;
        }
        else {
          pJVar40 = std::
                    _Vector_base<(anonymous_namespace)::JBTIndex,_std::allocator<(anonymous_namespace)::JBTIndex>_>
                    ::_M_allocate(p_Var53,(size_t)__x_00);
          local_378 = pJVar40 + (long)p_Var53;
        }
        pcVar7 = (pBVar39->Backtraces).
                 super__Vector_base<cmListFileBacktrace,_std::allocator<cmListFileBacktrace>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
        pJVar16 = pJVar40;
        for (bt_01 = (pBVar39->Backtraces).
                     super__Vector_base<cmListFileBacktrace,_std::allocator<cmListFileBacktrace>_>.
                     _M_impl.super__Vector_impl_data._M_start; bt_01 != pcVar7; bt_01 = bt_01 + 1) {
          __n = bt_01;
          JVar27 = BacktraceData::Add(local_130,bt_01);
          if (pJVar40 == local_378) {
            lVar47 = (long)pJVar40 - (long)pJVar16;
            if (lVar47 == 0x7ffffffffffffffc) {
              std::__throw_length_error("vector::_M_realloc_insert");
            }
            uVar41 = lVar47 >> 2;
            uVar55 = uVar41;
            if (pJVar40 == pJVar16) {
              uVar55 = 1;
            }
            p_Var53 = (_Vector_base<(anonymous_namespace)::JBTIndex,_std::allocator<(anonymous_namespace)::JBTIndex>_>
                       *)(uVar55 + uVar41);
            if ((_Vector_base<(anonymous_namespace)::JBTIndex,_std::allocator<(anonymous_namespace)::JBTIndex>_>
                 *)0x1ffffffffffffffe < p_Var53) {
              p_Var53 = (_Vector_base<(anonymous_namespace)::JBTIndex,_std::allocator<(anonymous_namespace)::JBTIndex>_>
                         *)0x1fffffffffffffff;
            }
            if (CARRY8(uVar55,uVar41)) {
              p_Var53 = (_Vector_base<(anonymous_namespace)::JBTIndex,_std::allocator<(anonymous_namespace)::JBTIndex>_>
                         *)0x1fffffffffffffff;
            }
            local_370 = std::
                        _Vector_base<(anonymous_namespace)::JBTIndex,_std::allocator<(anonymous_namespace)::JBTIndex>_>
                        ::_M_allocate(p_Var53,(size_t)__n);
            *(ArrayIndex *)((long)local_370 + lVar47) = JVar27.Index;
            pJVar54 = local_370;
            for (pJVar42 = pJVar16; pJVar40 != pJVar42; pJVar42 = pJVar42 + 1) {
              pJVar54->Index = pJVar42->Index;
              pJVar54 = pJVar54 + 1;
            }
            if (pJVar16 != (pointer)0x0) {
              operator_delete(pJVar16,(long)local_378 - (long)pJVar16);
            }
            local_378 = local_370 + (long)p_Var53;
          }
          else {
            pJVar40->Index = JVar27.Index;
            pJVar54 = pJVar40;
            local_370 = pJVar16;
          }
          pJVar40 = pJVar54 + 1;
          pJVar16 = local_370;
        }
        obj_dir._M_dataplus._M_p = (pointer)&obj_dir.field_2;
        pcVar64 = (pBVar39->Value)._M_dataplus._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&obj_dir,pcVar64,pcVar64 + (pBVar39->Value)._M_string_length);
        artifact.limit_ =
             (ptrdiff_t)
             std::
             _Vector_base<(anonymous_namespace)::JBTIndex,_std::allocator<(anonymous_namespace)::JBTIndex>_>
             ::_M_allocate((_Vector_base<(anonymous_namespace)::JBTIndex,_std::allocator<(anonymous_namespace)::JBTIndex>_>
                            *)((long)pJVar40 - (long)pJVar16 >> 2),(size_t)pcVar64);
        p_Var36 = (_Base_ptr)artifact.limit_;
        for (pJVar54 = pJVar16; pJVar54 != pJVar40; pJVar54 = pJVar54 + 1) {
          p_Var36->_M_color = pJVar54->Index;
          p_Var36 = (_Base_ptr)&p_Var36->field_0x4;
        }
        paVar73 = &obj_dir.field_2;
        artifact.comments_.ptr_._M_t.
        super___uniq_ptr_impl<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
        .
        super__Head_base<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_false>
        ._M_head_impl._4_1_ = (undefined1)((ulong)obj_dir.field_2._0_8_ >> 0x20);
        artifact.comments_.ptr_._M_t.
        super___uniq_ptr_impl<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
        .
        super__Head_base<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_false>
        ._M_head_impl._5_1_ = (undefined1)((ulong)obj_dir.field_2._0_8_ >> 0x28);
        artifact.comments_.ptr_._M_t.
        super___uniq_ptr_impl<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
        .
        super__Head_base<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_false>
        ._M_head_impl._6_1_ = (undefined1)((ulong)obj_dir.field_2._0_8_ >> 0x30);
        artifact.comments_.ptr_._M_t.
        super___uniq_ptr_impl<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
        .
        super__Head_base<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_false>
        ._M_head_impl._7_1_ = (undefined1)((ulong)obj_dir.field_2._0_8_ >> 0x38);
        artifact.comments_.ptr_._M_t.
        super___uniq_ptr_impl<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
        .
        super__Head_base<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_false>
        ._M_head_impl._0_4_ = (uint)obj_dir.field_2._M_allocated_capacity;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)obj_dir._M_dataplus._M_p == paVar73) {
          artifact.start_._0_5_ = (undefined5)obj_dir.field_2._8_8_;
          artifact.start_._5_1_ = (undefined1)((ulong)obj_dir.field_2._8_8_ >> 0x28);
          artifact.start_._6_2_ = (undefined2)((ulong)obj_dir.field_2._8_8_ >> 0x30);
          artifact.value_ = (ValueHolder)&artifact.comments_;
        }
        else {
          artifact.value_ = (ValueHolder)obj_dir._M_dataplus._M_p;
        }
        local_2c8._0_8_ = artifact.limit_ + ((long)pJVar40 - (long)pJVar16);
        artifact._8_8_ = obj_dir._M_string_length;
        obj_dir._M_string_length = 0;
        obj_dir.field_2._M_allocated_capacity =
             obj_dir.field_2._M_allocated_capacity & 0xffffffffffffff00;
        obj_dir._M_dataplus._M_p = (pointer)paVar73;
        if (pJVar16 != (pointer)0x0) {
          operator_delete(pJVar16,(long)local_378 - (long)pJVar16);
        }
        std::__cxx11::string::operator=((string *)(iVar37._M_node + 4),(string *)&artifact);
        pvVar8 = *(void **)(iVar37._M_node + 5);
        p_Var49 = iVar37._M_node[5]._M_left;
        *(ptrdiff_t *)(iVar37._M_node + 5) = artifact.limit_;
        iVar37._M_node[5]._M_parent = p_Var36;
        iVar37._M_node[5]._M_left = (_Base_ptr)local_2c8._0_8_;
        artifact.limit_ = 0;
        local_2c8._0_8_ = (_Base_ptr)0x0;
        if (pvVar8 != (void *)0x0) {
          operator_delete(pvVar8,(long)p_Var49 - (long)pvVar8);
        }
        if (artifact.limit_ != 0) {
          operator_delete((void *)artifact.limit_,local_2c8._0_8_ - artifact.limit_);
        }
        if (artifact.value_ != &artifact.comments_) {
          operator_delete(artifact.value_.string_,
                          CONCAT17(artifact.comments_.ptr_._M_t.
                                   super___uniq_ptr_impl<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
                                   .
                                   super__Head_base<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_false>
                                   ._M_head_impl._7_1_,
                                   CONCAT16(artifact.comments_.ptr_._M_t.
                                            super___uniq_ptr_impl<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
                                            ._M_t.
                                            super__Tuple_impl<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
                                            .
                                            super__Head_base<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_false>
                                            ._M_head_impl._6_1_,
                                            CONCAT15(artifact.comments_.ptr_._M_t.
                                                                                                          
                                                  super___uniq_ptr_impl<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_false>
                                                  ._M_head_impl._5_1_,
                                                  CONCAT14(artifact.comments_.ptr_._M_t.
                                                                                                                      
                                                  super___uniq_ptr_impl<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_false>
                                                  ._M_head_impl._4_1_,
                                                  (uint)artifact.comments_.ptr_._M_t.
                                                                                                                
                                                  super___uniq_ptr_impl<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_false>
                                                  ._M_head_impl)))) + 1);
        }
      }
      std::
      vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~vector((vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 *)&installGens);
      std::
      vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~vector((vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 *)&__dnew);
      std::
      _Rb_tree<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Identity<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~_Rb_tree((_Rb_tree<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Identity<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *)&launchers);
      uVar43 = std::_Rb_tree_increment(local_128);
    } while ((size_type *)uVar43 != &p._M_string_length);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&p);
  Json::Value::Value((Value *)&installGens,nullValue);
  obj_dir.field_2._8_8_ = &obj_dir._M_string_length;
  obj_dir._M_string_length = obj_dir._M_string_length & 0xffffffff00000000;
  obj_dir.field_2._M_allocated_capacity = 0;
  this_04 = (BacktraceData *)this->GT->Target;
  cmTarget::GetAllFileSetNames_abi_cxx11_
            ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&compileGroups,(cmTarget *)this_04);
  if (compileGroups.value_.int_ != compileGroups._8_8_) {
    Json::Value::Value(&artifact,arrayValue);
    Json::Value::operator=((Value *)&installGens,&artifact);
    Json::Value::~Value(&artifact);
    if (compileGroups.value_.int_ != compileGroups._8_8_) {
      mVar17 = 0;
      VVar66 = compileGroups.value_;
      local_130 = this_04;
      do {
        this_02 = cmTarget::GetFileSet((cmTarget *)this_04,(string *)VVar66.map_);
        if (this_02 == (cmFileSet *)0x0) {
          pcVar4 = this->GT->Makefile;
          psVar28 = cmTarget::GetName_abi_cxx11_((cmTarget *)this_04);
          artifact.value_.int_ = 8;
          artifact._8_8_ = (long)"\nTarget \"" + 1;
          artifact.comments_.ptr_._M_t.
          super___uniq_ptr_impl<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
          .
          super__Head_base<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_false>
          ._M_head_impl._0_4_ = 0;
          artifact.comments_.ptr_._M_t.
          super___uniq_ptr_impl<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
          .
          super__Head_base<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_false>
          ._M_head_impl._4_1_ = 0;
          artifact.comments_.ptr_._M_t.
          super___uniq_ptr_impl<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
          .
          super__Head_base<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_false>
          ._M_head_impl._5_1_ = 0;
          artifact.comments_.ptr_._M_t.
          super___uniq_ptr_impl<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
          .
          super__Head_base<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_false>
          ._M_head_impl._6_1_ = 0;
          artifact.comments_.ptr_._M_t.
          super___uniq_ptr_impl<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
          .
          super__Head_base<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_false>
          ._M_head_impl._7_1_ = 0;
          artifact.limit_ = (ptrdiff_t)(psVar28->_M_dataplus)._M_p;
          sVar9 = psVar28->_M_string_length;
          artifact.start_._0_5_ = (undefined5)sVar9;
          artifact.start_._5_1_ = (undefined1)(sVar9 >> 0x28);
          artifact.start_._6_2_ = (undefined2)(sVar9 >> 0x30);
          local_2c8._0_8_ = (_Base_ptr)0x1f;
          local_2c8._8_8_ = "\" is tracked to have file set \"";
          local_2b8._M_p = (pointer)0x0;
          local_2a8._0_8_ = *(undefined8 *)VVar66.string_;
          local_2b0 = *(undefined1 (*) [8])
                       &((VVar66.map_)->_M_t)._M_impl.super__Rb_tree_header._M_header;
          local_2a8._8_8_ = (_Base_ptr)0x0;
          local_2a8._16_8_ = (_Base_ptr)0x18;
          local_2a8._24_8_ = "\", but it was not found.";
          local_288 = (pointer)0x0;
          views_00._M_len = 5;
          views_00._M_array = (iterator)&artifact;
          cmCatViews(&p,views_00);
          cmMakefile::IssueMessage(pcVar4,INTERNAL_ERROR,&p);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)p._M_dataplus._M_p != &p.field_2) {
            operator_delete(p._M_dataplus._M_p,p.field_2._M_allocated_capacity + 1);
          }
        }
        else {
          cmFileSet::CompileFileEntries(&fileEntries,this_02);
          cmFileSet::CompileDirectoryEntries(&directoryEntries,this_02);
          cmFileSet::EvaluateDirectoryEntries
                    (&directories,this_02,&directoryEntries,this->GT->LocalGenerator,this->Config,
                     this->GT,(cmGeneratorExpressionDAGChecker *)0x0);
          Json::Value::Value((Value *)&__dnew,objectValue);
          Json::Value::Value(&artifact,&this_02->Name);
          pVVar29 = Json::Value::operator[]((Value *)&__dnew,"name");
          Json::Value::operator=(pVVar29,&artifact);
          Json::Value::~Value(&artifact);
          Json::Value::Value(&artifact,&this_02->Type);
          pVVar29 = Json::Value::operator[]((Value *)&__dnew,"type");
          Json::Value::operator=(pVVar29,&artifact);
          Json::Value::~Value(&artifact);
          sVar76 = cmFileSetVisibilityToName(this_02->Visibility);
          p._M_dataplus._M_p = (pointer)&p.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&p,sVar76.super_string_view._M_str,
                     sVar76.super_string_view._M_str + sVar76.super_string_view._M_len);
          Json::Value::Value(&artifact,&p);
          pVVar29 = Json::Value::operator[]((Value *)&__dnew,"visibility");
          Json::Value::operator=(pVVar29,&artifact);
          Json::Value::~Value(&artifact);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)p._M_dataplus._M_p != &p.field_2) {
            operator_delete(p._M_dataplus._M_p,p.field_2._M_allocated_capacity + 1);
          }
          Json::Value::Value(&artifact,arrayValue);
          pbVar22 = directories.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
          for (in = directories.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start; in != pbVar22; in = in + 1) {
            cmSystemTools::RelativeIfUnder((string *)&folder,local_138,in);
            Json::Value::Value((Value *)&p,(String *)&folder);
            Json::Value::append(&artifact,(Value *)&p);
            Json::Value::~Value((Value *)&p);
            if (folder.value_ != &folder.comments_) {
              operator_delete(folder.value_.string_,
                              CONCAT71(folder.comments_.ptr_._M_t.
                                       super___uniq_ptr_impl<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
                                       ._M_t.
                                       super__Tuple_impl<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
                                       .
                                       super__Head_base<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_false>
                                       ._M_head_impl._1_7_,
                                       folder.comments_.ptr_._M_t.
                                       super___uniq_ptr_impl<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
                                       ._M_t.
                                       super__Tuple_impl<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
                                       .
                                       super__Head_base<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_false>
                                       ._M_head_impl._0_1_) + 1);
            }
          }
          pVVar29 = Json::Value::operator[]((Value *)&__dnew,"baseDirectories");
          Json::Value::operator=(pVVar29,&artifact);
          Json::Value::~Value(&artifact);
          Json::Value::append((Value *)&installGens,(Value *)&__dnew);
          Json::Value::~Value((Value *)&__dnew);
          puVar23 = fileEntries.
                    super__Vector_base<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>,_std::allocator<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
          local_320 = (BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)((ulong)local_320 & 0xffffffff00000000);
          local_318._M_allocated_capacity = 0;
          local_318._8_8_ = &local_320;
          local_308._8_8_ = 0;
          local_308._M_allocated_capacity = local_318._8_8_;
          for (cge = fileEntries.
                     super__Vector_base<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>,_std::allocator<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start; uVar43 = local_318._8_8_,
              cge != puVar23; cge = cge + 1) {
            cmFileSet::EvaluateFileEntry
                      (this_02,&directories,
                       (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                        *)&__dnew,cge,this->GT->LocalGenerator,this->Config,this->GT,
                       (cmGeneratorExpressionDAGChecker *)0x0);
          }
          for (; (_Rb_tree_node_base *)uVar43 != (_Rb_tree_node_base *)&local_320;
              uVar43 = std::_Rb_tree_increment((_Rb_tree_node_base *)uVar43)) {
            p_Var49 = ((_Rb_tree_node_base *)(uVar43 + 0x40))->_M_parent;
            for (p_Var36 = *(_Base_ptr *)(uVar43 + 0x40); p_Var36 != p_Var49; p_Var36 = p_Var36 + 1)
            {
              folder.value_.string_ = (char *)&folder.comments_;
              folder.bits_ = (anon_struct_4_2_14fb5ae2_for_bits_)0x0;
              folder._12_4_ = 0;
              folder.comments_.ptr_._M_t.
              super___uniq_ptr_impl<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
              .
              super__Head_base<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_false>
              ._M_head_impl._0_1_ = 0;
              if (((_Rb_tree_node_base *)(uVar43 + 0x20))->_M_parent == (_Base_ptr)0x0) {
                std::__cxx11::string::_M_assign((string *)&folder);
              }
              else {
                artifact.bits_ =
                     (anon_struct_4_2_14fb5ae2_for_bits_)
                     ((_Rb_tree_node_base *)(uVar43 + 0x20))->_M_color;
                artifact._12_4_ = *(undefined4 *)&((_Rb_tree_node_base *)(uVar43 + 0x20))->field_0x4
                ;
                artifact.value_ = (ValueHolder)((_Rb_tree_node_base *)(uVar43 + 0x20))->_M_parent;
                artifact.comments_.ptr_._M_t.
                super___uniq_ptr_impl<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
                ._M_t.
                super__Tuple_impl<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
                .
                super__Head_base<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_false>
                ._M_head_impl._0_4_ = 0;
                artifact.comments_.ptr_._M_t.
                super___uniq_ptr_impl<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
                ._M_t.
                super__Tuple_impl<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
                .
                super__Head_base<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_false>
                ._M_head_impl._4_1_ = 0;
                artifact.comments_.ptr_._M_t.
                super___uniq_ptr_impl<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
                ._M_t.
                super__Tuple_impl<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
                .
                super__Head_base<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_false>
                ._M_head_impl._5_1_ = 0;
                artifact.comments_.ptr_._M_t.
                super___uniq_ptr_impl<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
                ._M_t.
                super__Tuple_impl<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
                .
                super__Head_base<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_false>
                ._M_head_impl._6_1_ = 0;
                artifact.comments_.ptr_._M_t.
                super___uniq_ptr_impl<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
                ._M_t.
                super__Tuple_impl<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
                .
                super__Head_base<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_false>
                ._M_head_impl._7_1_ = 0;
                p._M_dataplus._M_p = (pointer)0x0;
                p._M_string_length = 1;
                p.field_2._M_allocated_capacity = (size_type)(&p.field_2._M_allocated_capacity + 1);
                p.field_2._M_local_buf[8] = 0x2f;
                artifact.start_._0_5_ = 1;
                artifact.start_._5_1_ = 0;
                artifact.start_._6_2_ = 0;
                local_2c8._8_8_ = *(undefined8 *)p_Var36;
                local_2c8._0_8_ = p_Var36->_M_parent;
                local_2b8._M_p = (pointer)0x0;
                views._M_len = 3;
                views._M_array = (iterator)&artifact;
                artifact.limit_ = p.field_2._M_allocated_capacity;
                cmCatViews((string *)&sourceGroups,views);
                std::__cxx11::string::operator=((string *)&folder,(string *)&sourceGroups);
                if (sourceGroups.value_ != &sourceGroups.comments_) {
                  operator_delete(sourceGroups.value_.string_,
                                  (long)sourceGroups.comments_.ptr_._M_t.
                                        super___uniq_ptr_impl<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
                                        ._M_t.
                                        super__Tuple_impl<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
                                        .
                                        super__Head_base<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_false>
                                        ._M_head_impl + 1);
                }
              }
              pmVar44 = std::
                        map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                        ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                                      *)&obj_dir,(key_type *)&folder);
              *pmVar44 = mVar17;
              if (folder.value_ != &folder.comments_) {
                operator_delete(folder.value_.string_,
                                CONCAT71(folder.comments_.ptr_._M_t.
                                         super___uniq_ptr_impl<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
                                         ._M_t.
                                         super__Tuple_impl<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
                                         .
                                         super__Head_base<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_false>
                                         ._M_head_impl._1_7_,
                                         folder.comments_.ptr_._M_t.
                                         super___uniq_ptr_impl<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
                                         ._M_t.
                                         super__Tuple_impl<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
                                         .
                                         super__Head_base<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_false>
                                         ._M_head_impl._0_1_) + 1);
              }
            }
          }
          mVar17 = mVar17 + 1;
          std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
          ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                       *)&__dnew);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector(&directories);
          std::
          vector<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>,_std::allocator<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>_>_>
          ::~vector(&directoryEntries);
          std::
          vector<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>,_std::allocator<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>_>_>
          ::~vector(&fileEntries);
          this_04 = local_130;
        }
        VVar66.string_ =
             (char *)&((VVar66.map_)->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right;
      } while (VVar66.int_ != compileGroups._8_8_);
    }
  }
  std::
  pair<Json::Value,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>_>
  ::
  pair<Json::Value_&,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>_&,_true>
            ((pair<Json::Value,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>_>
              *)&launchers,(Value *)&installGens,
             (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
              *)&obj_dir);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&compileGroups);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
               *)&obj_dir);
  Json::Value::~Value((Value *)&installGens);
  bVar24 = Json::Value::isNull(&launchers);
  if (!bVar24) {
    pVVar29 = Json::Value::operator[](__return_storage_ptr__,"fileSets");
    Json::Value::operator=(pVVar29,&launchers);
  }
  Json::Value::Value((Value *)&p,arrayValue);
  pKVar45 = cmGeneratorTarget::GetKindedSources(this->GT,this->Config);
  sk = (pKVar45->Sources).
       super__Vector_base<cmGeneratorTarget::SourceAndKind,_std::allocator<cmGeneratorTarget::SourceAndKind>_>
       ._M_impl.super__Vector_impl_data._M_start;
  pSVar10 = (pKVar45->Sources).
            super__Vector_base<cmGeneratorTarget::SourceAndKind,_std::allocator<cmGeneratorTarget::SourceAndKind>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  if (sk != pSVar10) {
    do {
      si = Json::Value::size((Value *)&p);
      DumpSource(&artifact,this,sk,si,(FileSetDatabase *)local_170);
      Json::Value::append((Value *)&p,&artifact);
      Json::Value::~Value(&artifact);
      sk = sk + 1;
    } while (sk != pSVar10);
  }
  pVVar29 = Json::Value::operator[](__return_storage_ptr__,"sources");
  Json::Value::operator=(pVVar29,(Value *)&p);
  Json::Value::~Value((Value *)&p);
  Json::Value::Value(&folder,nullValue);
  artifact.comments_.ptr_._M_t.
  super___uniq_ptr_impl<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
  .
  super__Head_base<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_false>
  ._M_head_impl._0_4_ = 0x444c4f46;
  artifact.comments_.ptr_._M_t.
  super___uniq_ptr_impl<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
  .
  super__Head_base<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_false>
  ._M_head_impl._4_1_ = 0x45;
  artifact.comments_.ptr_._M_t.
  super___uniq_ptr_impl<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
  .
  super__Head_base<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_false>
  ._M_head_impl._5_1_ = 0x52;
  artifact.bits_ = (anon_struct_4_2_14fb5ae2_for_bits_)0x6;
  artifact._12_4_ = 0;
  artifact.comments_.ptr_._M_t.
  super___uniq_ptr_impl<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
  .
  super__Head_base<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_false>
  ._M_head_impl._6_1_ = 0;
  artifact.value_ = (ValueHolder)&artifact.comments_;
  cVar34 = cmGeneratorTarget::GetProperty(this->GT,(string *)&artifact);
  if (artifact.value_ != &artifact.comments_) {
    operator_delete(artifact.value_.string_,
                    CONCAT17(artifact.comments_.ptr_._M_t.
                             super___uniq_ptr_impl<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
                             .
                             super__Head_base<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_false>
                             ._M_head_impl._7_1_,
                             CONCAT16(artifact.comments_.ptr_._M_t.
                                      super___uniq_ptr_impl<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
                                      ._M_t.
                                      super__Tuple_impl<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
                                      .
                                      super__Head_base<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_false>
                                      ._M_head_impl._6_1_,
                                      CONCAT15(artifact.comments_.ptr_._M_t.
                                               super___uniq_ptr_impl<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
                                               ._M_t.
                                               super__Tuple_impl<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
                                               .
                                               super__Head_base<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_false>
                                               ._M_head_impl._5_1_,
                                               CONCAT14(artifact.comments_.ptr_._M_t.
                                                                                                                
                                                  super___uniq_ptr_impl<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_false>
                                                  ._M_head_impl._4_1_,
                                                  (uint)artifact.comments_.ptr_._M_t.
                                                                                                                
                                                  super___uniq_ptr_impl<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_false>
                                                  ._M_head_impl)))) + 1);
  }
  if (cVar34.Value != (string *)0x0) {
    Json::Value::Value(&artifact,objectValue);
    Json::Value::operator=(&folder,&artifact);
    Json::Value::~Value(&artifact);
    Json::Value::Value(&artifact,cVar34.Value);
    pVVar29 = Json::Value::operator[](&folder,"name");
    Json::Value::operator=(pVVar29,&artifact);
    Json::Value::~Value(&artifact);
  }
  bVar24 = Json::Value::isNull(&folder);
  if (!bVar24) {
    pVVar29 = Json::Value::operator[](__return_storage_ptr__,"folder");
    Json::Value::operator=(pVVar29,&folder);
  }
  Json::Value::Value(&sourceGroups,arrayValue);
  value = (this->SourceGroups).
          super__Vector_base<(anonymous_namespace)::Target::SourceGroup,_std::allocator<(anonymous_namespace)::Target::SourceGroup>_>
          ._M_impl.super__Vector_impl_data._M_start;
  pSVar11 = (this->SourceGroups).
            super__Vector_base<(anonymous_namespace)::Target::SourceGroup,_std::allocator<(anonymous_namespace)::Target::SourceGroup>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  if (value != pSVar11) {
    do {
      Json::Value::Value((Value *)&p,objectValue);
      Json::Value::Value(&artifact,&value->Name);
      pVVar29 = Json::Value::operator[]((Value *)&p,"name");
      Json::Value::operator=(pVVar29,&artifact);
      Json::Value::~Value(&artifact);
      pVVar29 = Json::Value::operator[]((Value *)&p,"sourceIndexes");
      Json::Value::operator=(pVVar29,&value->SourceIndexes);
      Json::Value::append(&sourceGroups,(Value *)&p);
      Json::Value::~Value((Value *)&p);
      value = value + 1;
    } while (value != pSVar11);
  }
  bVar24 = Json::Value::empty(&sourceGroups);
  if (!bVar24) {
    pVVar29 = Json::Value::operator[](__return_storage_ptr__,"sourceGroups");
    Json::Value::operator=(pVVar29,&sourceGroups);
  }
  Json::Value::Value(&compileGroups,arrayValue);
  pCVar60 = (this->CompileGroups).
            super__Vector_base<(anonymous_namespace)::Target::CompileGroup,_std::allocator<(anonymous_namespace)::Target::CompileGroup>_>
            ._M_impl.super__Vector_impl_data._M_start;
  local_130 = (BacktraceData *)
              (this->CompileGroups).
              super__Vector_base<(anonymous_namespace)::Target::CompileGroup,_std::allocator<(anonymous_namespace)::Target::CompileGroup>_>
              ._M_impl.super__Vector_impl_data._M_finish;
  if ((BacktraceData *)pCVar60 != local_130) {
    local_128 = (_Rb_tree_node_base *)&this->CompileDataMap;
    local_140._M_nxt = (_Hash_node_base *)&(this->CompileDataMap)._M_t._M_impl.super__Rb_tree_header
    ;
    do {
      p_Var12 = (pCVar60->Entry).
                super__Node_iterator_base<std::pair<const_(anonymous_namespace)::CompileData,_unsigned_int>,_true>
                ._M_cur;
      artifact.value_.string_ = (char *)&artifact.comments_;
      artifact.bits_ = (anon_struct_4_2_14fb5ae2_for_bits_)0x0;
      artifact._12_4_ = 0;
      artifact.comments_.ptr_._M_t.
      super___uniq_ptr_impl<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
      .
      super__Head_base<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_false>
      ._M_head_impl._0_4_ =
           (uint)artifact.comments_.ptr_._M_t.
                 super___uniq_ptr_impl<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
                 .
                 super__Head_base<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_false>
                 ._M_head_impl & 0xffffff00;
      artifact.limit_ = (ptrdiff_t)local_2c8;
      local_2c8._0_8_ = local_2c8._0_8_ & 0xffffffffffffff00;
      p._M_dataplus._M_p = (pointer)&p.field_2;
      uVar55 = p.field_2._M_allocated_capacity >> 8;
      p.field_2._M_allocated_capacity = uVar55 << 8;
      pJVar50 = (JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)local_2a8;
      local_2a8._0_8_ = p.field_2._M_allocated_capacity;
      local_2a8._8_8_ = p.field_2._8_8_;
      local_2b0 = (undefined1  [8])0x0;
      p._M_string_length = 0;
      p.field_2._M_allocated_capacity = uVar55 << 8;
      local_2b8._M_p = (pointer)pJVar50;
      memset(local_2a8 + 0x10,0,0x90);
      std::__cxx11::string::_M_assign((string *)&artifact);
      pJVar46 = local_268.
                super__Vector_base<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      if (artifact._8_8_ != 0) {
        iVar37 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CompileData,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CompileData>_>_>
                 ::lower_bound((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CompileData,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CompileData>_>_>
                                *)local_128,(key_type *)&artifact);
        if ((iVar37._M_node == (_Base_ptr)local_140._M_nxt) ||
           (iVar26 = std::__cxx11::string::compare((string *)&artifact), iVar26 < 0)) {
          std::__throw_out_of_range("map::at");
        }
        p_Var70 = iVar37._M_node + 3;
        std::__cxx11::string::_M_assign((string *)&artifact.limit_);
        if ((pointer *)&iVar37._M_node[7]._M_parent != &local_250) {
          p_Var36 = iVar37._M_node[7]._M_parent;
          p_Var49 = iVar37._M_node[7]._M_left;
          local_138 = (string *)((long)p_Var49 - (long)p_Var36);
          if ((string *)((long)local_240 - (long)local_250) < local_138) {
            pJVar46 = std::
                      _Vector_base<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      ::_M_allocate((_Vector_base<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                     *)(((long)local_138 >> 3) * -0x3333333333333333),
                                    (size_t)p_Var70);
            local_208 = pJVar46;
            pJVar61 = local_248;
            psVar28 = local_138;
            for (; local_248 = pJVar61, local_138 = psVar28, p_Var36 != p_Var49;
                p_Var36 = (_Base_ptr)&p_Var36[1]._M_parent) {
              (pJVar46->Value)._M_dataplus._M_p = (pointer)&(pJVar46->Value).field_2;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)pJVar46,*(long *)p_Var36,
                         (long)&p_Var36->_M_parent->_M_color + *(long *)p_Var36);
              (pJVar46->Backtrace).Index = p_Var36[1]._M_color;
              pJVar46 = pJVar46 + 1;
              pJVar61 = local_248;
              psVar28 = local_138;
            }
            if (local_250 != pJVar61) {
              paVar73 = &(local_250->Value).field_2;
              do {
                plVar13 = (long *)(((String *)(paVar73 + -1))->_M_dataplus)._M_p;
                if (paVar73 !=
                    (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)plVar13) {
                  operator_delete(plVar13,paVar73->_M_allocated_capacity + 1);
                }
                pJVar46 = (pointer)((long)paVar73 + 0x18);
                paVar73 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)((long)paVar73 + 0x28);
              } while (pJVar46 != pJVar61);
            }
            if (local_250 != (pointer)0x0) {
              operator_delete(local_250,(long)local_240 - (long)local_250);
            }
            local_250 = local_208;
            local_240 = (pointer)((long)&(local_208->Value)._M_dataplus._M_p +
                                 (long)&(psVar28->_M_dataplus)._M_p);
          }
          else {
            psVar28 = (string *)((long)local_248 - (long)local_250);
            if (psVar28 < local_138) {
              if (0 < (long)psVar28) {
                lVar47 = (ulong)psVar28 / 0x28 + 1;
                pJVar46 = local_250;
                do {
                  std::__cxx11::string::_M_assign((string *)pJVar46);
                  (pJVar46->Backtrace).Index = p_Var36[1]._M_color;
                  p_Var36 = (_Base_ptr)&p_Var36[1]._M_parent;
                  pJVar46 = pJVar46 + 1;
                  lVar47 = lVar47 + -1;
                } while (1 < lVar47);
              }
              p_Var36 = iVar37._M_node[7]._M_left;
              pJVar46 = local_248;
              for (p_Var49 = (_Base_ptr)
                             (((long)local_248 - (long)local_250) +
                             (long)iVar37._M_node[7]._M_parent); p_Var49 != p_Var36;
                  p_Var49 = (_Base_ptr)&p_Var49[1]._M_parent) {
                (pJVar46->Value)._M_dataplus._M_p = (pointer)&(pJVar46->Value).field_2;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)pJVar46,*(long *)p_Var49,
                           (long)&p_Var49->_M_parent->_M_color + *(long *)p_Var49);
                (pJVar46->Backtrace).Index = p_Var49[1]._M_color;
                pJVar46 = pJVar46 + 1;
              }
            }
            else {
              pJVar46 = local_250;
              if (0 < (long)local_138) {
                lVar47 = (ulong)local_138 / 0x28 + 1;
                do {
                  std::__cxx11::string::_M_assign((string *)pJVar46);
                  (pJVar46->Backtrace).Index = p_Var36[1]._M_color;
                  p_Var36 = (_Base_ptr)&p_Var36[1]._M_parent;
                  pJVar46 = pJVar46 + 1;
                  lVar47 = lVar47 + -1;
                } while (1 < lVar47);
              }
              pJVar61 = local_248;
              if (pJVar46 != local_248) {
                paVar73 = &(pJVar46->Value).field_2;
                do {
                  plVar13 = (long *)(((String *)(paVar73 + -1))->_M_dataplus)._M_p;
                  if (paVar73 !=
                      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)plVar13) {
                    operator_delete(plVar13,paVar73->_M_allocated_capacity + 1);
                  }
                  pJVar46 = (pointer)((long)paVar73 + 0x18);
                  paVar73 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)((long)paVar73 + 0x28);
                } while (pJVar46 != pJVar61);
              }
            }
          }
          local_248 = (pointer)((long)&(local_138->_M_dataplus)._M_p +
                               (long)&(local_250->Value)._M_dataplus);
        }
        p_Var70 = iVar37._M_node + 4;
        std::__cxx11::string::_M_assign((string *)&local_2b8);
        if (iVar37._M_node + 4 != (_Base_ptr)&local_2b8) {
          p_Var36 = *(_Base_ptr *)(iVar37._M_node + 5);
          p_Var49 = iVar37._M_node[5]._M_parent;
          uVar55 = (long)p_Var49 - (long)p_Var36;
          if ((ulong)((long)local_288 - local_2a8._16_8_) < uVar55) {
            __dest = (_Base_ptr)
                     std::
                     _Vector_base<(anonymous_namespace)::JBTIndex,_std::allocator<(anonymous_namespace)::JBTIndex>_>
                     ::_M_allocate((_Vector_base<(anonymous_namespace)::JBTIndex,_std::allocator<(anonymous_namespace)::JBTIndex>_>
                                    *)((long)uVar55 >> 2),(size_t)p_Var70);
            if (p_Var36 != p_Var49) {
              memcpy(__dest,p_Var36,(uVar55 - 4 & 0xfffffffffffffffc) + 4);
            }
            if ((_Base_ptr)local_2a8._16_8_ != (_Base_ptr)0x0) {
              operator_delete((void *)local_2a8._16_8_,(long)local_288 - local_2a8._16_8_);
            }
            local_288 = (pointer)((long)__dest + uVar55);
            local_2a8._16_8_ = __dest;
          }
          else if ((ulong)(local_2a8._24_8_ - local_2a8._16_8_) < uVar55) {
            if (local_2a8._24_8_ != local_2a8._16_8_) {
              memmove((void *)local_2a8._16_8_,p_Var36,local_2a8._24_8_ - local_2a8._16_8_);
            }
            p_Var36 = iVar37._M_node[5]._M_parent;
            for (p_Var49 = (_Base_ptr)
                           ((local_2a8._24_8_ - local_2a8._16_8_) + *(long *)(iVar37._M_node + 5));
                p_Var49 != p_Var36; p_Var49 = (_Base_ptr)&p_Var49->field_0x4) {
              ((_Base_ptr)local_2a8._24_8_)->_M_color = p_Var49->_M_color;
              local_2a8._24_8_ = &((_Base_ptr)local_2a8._24_8_)->field_0x4;
            }
          }
          else if (p_Var49 != p_Var36) {
            memmove((void *)local_2a8._16_8_,p_Var36,uVar55);
          }
          local_2a8._24_8_ = uVar55 + local_2a8._16_8_;
        }
        std::
        vector<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::reserve(&local_280,
                  (*(long *)((long)&(p_Var12->
                                    super__Hash_node_value<std::pair<const_(anonymous_namespace)::CompileData,_unsigned_int>,_true>
                                    ).
                                    super__Hash_node_value_base<std::pair<const_(anonymous_namespace)::CompileData,_unsigned_int>_>
                                    ._M_storage._M_storage + 0x80) -
                   *(long *)((long)&(p_Var12->
                                    super__Hash_node_value<std::pair<const_(anonymous_namespace)::CompileData,_unsigned_int>,_true>
                                    ).
                                    super__Hash_node_value_base<std::pair<const_(anonymous_namespace)::CompileData,_unsigned_int>_>
                                    ._M_storage._M_storage + 0x78) >> 3) * -0x3333333333333333 +
                  (*(long *)(iVar37._M_node + 6) - (long)iVar37._M_node[5]._M_right >> 3) *
                  -0x3333333333333333);
        std::
        vector<(anonymous_namespace)::JBT<std::__cxx11::string>,std::allocator<(anonymous_namespace)::JBT<std::__cxx11::string>>>
        ::
        insert<__gnu_cxx::__normal_iterator<(anonymous_namespace)::JBT<std::__cxx11::string>const*,std::vector<(anonymous_namespace)::JBT<std::__cxx11::string>,std::allocator<(anonymous_namespace)::JBT<std::__cxx11::string>>>>,void>
                  ((vector<(anonymous_namespace)::JBT<std::__cxx11::string>,std::allocator<(anonymous_namespace)::JBT<std::__cxx11::string>>>
                    *)&local_280,
                   (const_iterator)
                   local_280.
                   super__Vector_base<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish,
                   (JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)iVar37._M_node[5]._M_right,
                   *(JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     **)(iVar37._M_node + 6));
        std::
        vector<(anonymous_namespace)::JBT<std::__cxx11::string>,std::allocator<(anonymous_namespace)::JBT<std::__cxx11::string>>>
        ::
        insert<__gnu_cxx::__normal_iterator<(anonymous_namespace)::JBT<std::__cxx11::string>const*,std::vector<(anonymous_namespace)::JBT<std::__cxx11::string>,std::allocator<(anonymous_namespace)::JBT<std::__cxx11::string>>>>,void>
                  ((vector<(anonymous_namespace)::JBT<std::__cxx11::string>,std::allocator<(anonymous_namespace)::JBT<std::__cxx11::string>>>
                    *)&local_280,
                   (const_iterator)
                   local_280.
                   super__Vector_base<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish,
                   *(JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     **)((long)&(p_Var12->
                                super__Hash_node_value<std::pair<const_(anonymous_namespace)::CompileData,_unsigned_int>,_true>
                                ).
                                super__Hash_node_value_base<std::pair<const_(anonymous_namespace)::CompileData,_unsigned_int>_>
                                ._M_storage._M_storage + 0x78),
                   *(JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     **)((long)&(p_Var12->
                                super__Hash_node_value<std::pair<const_(anonymous_namespace)::CompileData,_unsigned_int>,_true>
                                ).
                                super__Hash_node_value_base<std::pair<const_(anonymous_namespace)::CompileData,_unsigned_int>_>
                                ._M_storage._M_storage + 0x80));
        std::
        vector<(anonymous_namespace)::CompileData::IncludeEntry,_std::allocator<(anonymous_namespace)::CompileData::IncludeEntry>_>
        ::reserve(&local_238,
                  ((long)iVar37._M_node[8]._M_parent - *(long *)(iVar37._M_node + 8) >> 4) *
                  -0x5555555555555555 +
                  (*(long *)((long)&(p_Var12->
                                    super__Hash_node_value<std::pair<const_(anonymous_namespace)::CompileData,_unsigned_int>,_true>
                                    ).
                                    super__Hash_node_value_base<std::pair<const_(anonymous_namespace)::CompileData,_unsigned_int>_>
                                    ._M_storage._M_storage + 200) -
                   *(long *)((long)&(p_Var12->
                                    super__Hash_node_value<std::pair<const_(anonymous_namespace)::CompileData,_unsigned_int>,_true>
                                    ).
                                    super__Hash_node_value_base<std::pair<const_(anonymous_namespace)::CompileData,_unsigned_int>_>
                                    ._M_storage._M_storage + 0xc0) >> 4) * -0x5555555555555555);
        std::
        vector<(anonymous_namespace)::CompileData::IncludeEntry,std::allocator<(anonymous_namespace)::CompileData::IncludeEntry>>
        ::
        insert<__gnu_cxx::__normal_iterator<(anonymous_namespace)::CompileData::IncludeEntry_const*,std::vector<(anonymous_namespace)::CompileData::IncludeEntry,std::allocator<(anonymous_namespace)::CompileData::IncludeEntry>>>,void>
                  ((vector<(anonymous_namespace)::CompileData::IncludeEntry,std::allocator<(anonymous_namespace)::CompileData::IncludeEntry>>
                    *)&local_238,
                   (const_iterator)
                   local_238.
                   super__Vector_base<(anonymous_namespace)::CompileData::IncludeEntry,_std::allocator<(anonymous_namespace)::CompileData::IncludeEntry>_>
                   ._M_impl.super__Vector_impl_data._M_finish,
                   *(IncludeEntry **)
                    ((long)&(p_Var12->
                            super__Hash_node_value<std::pair<const_(anonymous_namespace)::CompileData,_unsigned_int>,_true>
                            ).
                            super__Hash_node_value_base<std::pair<const_(anonymous_namespace)::CompileData,_unsigned_int>_>
                            ._M_storage._M_storage + 0xc0),
                   *(IncludeEntry **)
                    ((long)&(p_Var12->
                            super__Hash_node_value<std::pair<const_(anonymous_namespace)::CompileData,_unsigned_int>,_true>
                            ).
                            super__Hash_node_value_base<std::pair<const_(anonymous_namespace)::CompileData,_unsigned_int>_>
                            ._M_storage._M_storage + 200));
        std::
        vector<(anonymous_namespace)::CompileData::IncludeEntry,std::allocator<(anonymous_namespace)::CompileData::IncludeEntry>>
        ::
        insert<__gnu_cxx::__normal_iterator<(anonymous_namespace)::CompileData::IncludeEntry_const*,std::vector<(anonymous_namespace)::CompileData::IncludeEntry,std::allocator<(anonymous_namespace)::CompileData::IncludeEntry>>>,void>
                  ((vector<(anonymous_namespace)::CompileData::IncludeEntry,std::allocator<(anonymous_namespace)::CompileData::IncludeEntry>>
                    *)&local_238,
                   (const_iterator)
                   local_238.
                   super__Vector_base<(anonymous_namespace)::CompileData::IncludeEntry,_std::allocator<(anonymous_namespace)::CompileData::IncludeEntry>_>
                   ._M_impl.super__Vector_impl_data._M_finish,*(IncludeEntry **)(iVar37._M_node + 8)
                   ,(IncludeEntry *)iVar37._M_node[8]._M_parent);
        std::
        vector<(anonymous_namespace)::CompileData::IncludeEntry,_std::allocator<(anonymous_namespace)::CompileData::IncludeEntry>_>
        ::reserve(&local_220,
                  (*(long *)(iVar37._M_node + 9) - (long)iVar37._M_node[8]._M_right >> 4) *
                  -0x5555555555555555 +
                  (*(long *)((long)&(p_Var12->
                                    super__Hash_node_value<std::pair<const_(anonymous_namespace)::CompileData,_unsigned_int>,_true>
                                    ).
                                    super__Hash_node_value_base<std::pair<const_(anonymous_namespace)::CompileData,_unsigned_int>_>
                                    ._M_storage._M_storage + 0xe0) -
                   *(long *)((long)&(p_Var12->
                                    super__Hash_node_value<std::pair<const_(anonymous_namespace)::CompileData,_unsigned_int>,_true>
                                    ).
                                    super__Hash_node_value_base<std::pair<const_(anonymous_namespace)::CompileData,_unsigned_int>_>
                                    ._M_storage._M_storage + 0xd8) >> 4) * -0x5555555555555555);
        std::
        vector<(anonymous_namespace)::CompileData::IncludeEntry,std::allocator<(anonymous_namespace)::CompileData::IncludeEntry>>
        ::
        insert<__gnu_cxx::__normal_iterator<(anonymous_namespace)::CompileData::IncludeEntry_const*,std::vector<(anonymous_namespace)::CompileData::IncludeEntry,std::allocator<(anonymous_namespace)::CompileData::IncludeEntry>>>,void>
                  ((vector<(anonymous_namespace)::CompileData::IncludeEntry,std::allocator<(anonymous_namespace)::CompileData::IncludeEntry>>
                    *)&local_220,
                   (const_iterator)
                   local_220.
                   super__Vector_base<(anonymous_namespace)::CompileData::IncludeEntry,_std::allocator<(anonymous_namespace)::CompileData::IncludeEntry>_>
                   ._M_impl.super__Vector_impl_data._M_finish,
                   *(IncludeEntry **)
                    ((long)&(p_Var12->
                            super__Hash_node_value<std::pair<const_(anonymous_namespace)::CompileData,_unsigned_int>,_true>
                            ).
                            super__Hash_node_value_base<std::pair<const_(anonymous_namespace)::CompileData,_unsigned_int>_>
                            ._M_storage._M_storage + 0xd8),
                   *(IncludeEntry **)
                    ((long)&(p_Var12->
                            super__Hash_node_value<std::pair<const_(anonymous_namespace)::CompileData,_unsigned_int>,_true>
                            ).
                            super__Hash_node_value_base<std::pair<const_(anonymous_namespace)::CompileData,_unsigned_int>_>
                            ._M_storage._M_storage + 0xe0));
        std::
        vector<(anonymous_namespace)::CompileData::IncludeEntry,std::allocator<(anonymous_namespace)::CompileData::IncludeEntry>>
        ::
        insert<__gnu_cxx::__normal_iterator<(anonymous_namespace)::CompileData::IncludeEntry_const*,std::vector<(anonymous_namespace)::CompileData::IncludeEntry,std::allocator<(anonymous_namespace)::CompileData::IncludeEntry>>>,void>
                  ((vector<(anonymous_namespace)::CompileData::IncludeEntry,std::allocator<(anonymous_namespace)::CompileData::IncludeEntry>>
                    *)&local_220,
                   (const_iterator)
                   local_220.
                   super__Vector_base<(anonymous_namespace)::CompileData::IncludeEntry,_std::allocator<(anonymous_namespace)::CompileData::IncludeEntry>_>
                   ._M_impl.super__Vector_impl_data._M_finish,
                   (IncludeEntry *)iVar37._M_node[8]._M_right,*(IncludeEntry **)(iVar37._M_node + 9)
                  );
        std::
        vector<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::reserve(&local_268,
                  (*(long *)((long)&(p_Var12->
                                    super__Hash_node_value<std::pair<const_(anonymous_namespace)::CompileData,_unsigned_int>,_true>
                                    ).
                                    super__Hash_node_value_base<std::pair<const_(anonymous_namespace)::CompileData,_unsigned_int>_>
                                    ._M_storage._M_storage + 0x98) -
                   *(long *)((long)&(p_Var12->
                                    super__Hash_node_value<std::pair<const_(anonymous_namespace)::CompileData,_unsigned_int>,_true>
                                    ).
                                    super__Hash_node_value_base<std::pair<const_(anonymous_namespace)::CompileData,_unsigned_int>_>
                                    ._M_storage._M_storage + 0x90) >> 3) * -0x3333333333333333 +
                  ((long)iVar37._M_node[6]._M_right - (long)iVar37._M_node[6]._M_left >> 3) *
                  -0x3333333333333333);
        std::
        vector<(anonymous_namespace)::JBT<std::__cxx11::string>,std::allocator<(anonymous_namespace)::JBT<std::__cxx11::string>>>
        ::
        insert<__gnu_cxx::__normal_iterator<(anonymous_namespace)::JBT<std::__cxx11::string>const*,std::vector<(anonymous_namespace)::JBT<std::__cxx11::string>,std::allocator<(anonymous_namespace)::JBT<std::__cxx11::string>>>>,void>
                  ((vector<(anonymous_namespace)::JBT<std::__cxx11::string>,std::allocator<(anonymous_namespace)::JBT<std::__cxx11::string>>>
                    *)&local_268,
                   (const_iterator)
                   local_268.
                   super__Vector_base<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish,
                   (JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)iVar37._M_node[6]._M_left,
                   (JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)iVar37._M_node[6]._M_right);
        std::
        vector<(anonymous_namespace)::JBT<std::__cxx11::string>,std::allocator<(anonymous_namespace)::JBT<std::__cxx11::string>>>
        ::
        insert<__gnu_cxx::__normal_iterator<(anonymous_namespace)::JBT<std::__cxx11::string>const*,std::vector<(anonymous_namespace)::JBT<std::__cxx11::string>,std::allocator<(anonymous_namespace)::JBT<std::__cxx11::string>>>>,void>
                  ((vector<(anonymous_namespace)::JBT<std::__cxx11::string>,std::allocator<(anonymous_namespace)::JBT<std::__cxx11::string>>>
                    *)&local_268,
                   (const_iterator)
                   local_268.
                   super__Vector_base<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish,
                   *(JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     **)((long)&(p_Var12->
                                super__Hash_node_value<std::pair<const_(anonymous_namespace)::CompileData,_unsigned_int>,_true>
                                ).
                                super__Hash_node_value_base<std::pair<const_(anonymous_namespace)::CompileData,_unsigned_int>_>
                                ._M_storage._M_storage + 0x90),
                   *(JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     **)((long)&(p_Var12->
                                super__Hash_node_value<std::pair<const_(anonymous_namespace)::CompileData,_unsigned_int>,_true>
                                ).
                                super__Hash_node_value_base<std::pair<const_(anonymous_namespace)::CompileData,_unsigned_int>_>
                                ._M_storage._M_storage + 0x98));
        pJVar61 = local_268.
                  super__Vector_base<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
        pJVar46 = local_268.
                  super__Vector_base<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        pJVar50 = local_268.
                  super__Vector_base<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        if (local_268.
            super__Vector_base<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start !=
            local_268.
            super__Vector_base<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish) {
          lVar47 = ((long)local_268.
                          super__Vector_base<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                    (long)local_268.
                          super__Vector_base<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x3333333333333333;
          pJVar50 = (JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)-(lVar47 + 1 >> 0x3f);
          p._M_dataplus._M_p = (pointer)((long)pJVar50 + lVar47 + 1 >> 1);
          p_Var70 = (_Base_ptr)p._M_dataplus._M_p;
          if (0x333333333333332 < (long)p._M_dataplus._M_p) {
            p_Var70 = (_Base_ptr)0x333333333333333;
          }
          p._M_string_length = 0;
          p.field_2._M_allocated_capacity = 0;
          pvVar56 = (vector<(anonymous_namespace)::JBT<std::__cxx11::string>,std::allocator<(anonymous_namespace)::JBT<std::__cxx11::string>>>
                     *)&local_268;
          do {
            p_Var67 = p_Var70;
            if ((long)p_Var67 < 1) {
              pvVar71 = (vector<(anonymous_namespace)::JBT<std::__cxx11::string>,std::allocator<(anonymous_namespace)::JBT<std::__cxx11::string>>>
                         *)0x0;
              p_Var67 = (_Base_ptr)0x0;
              break;
            }
            pvVar48 = (vector<(anonymous_namespace)::JBT<std::__cxx11::string>,std::allocator<(anonymous_namespace)::JBT<std::__cxx11::string>>>
                       *)operator_new((long)p_Var67 * 0x28,(nothrow_t *)&std::nothrow);
            pvVar71 = pvVar48;
            p_Var70 = p_Var67;
            if (pvVar48 ==
                (vector<(anonymous_namespace)::JBT<std::__cxx11::string>,std::allocator<(anonymous_namespace)::JBT<std::__cxx11::string>>>
                 *)0x0) {
              pvVar71 = pvVar56;
              if (p_Var67 == (_Base_ptr)&DAT_00000001) {
                p_Var67 = iVar37._M_node;
                p_Var70 = (_Base_ptr)0x0;
              }
              else {
                p_Var18 = &p_Var67->_M_color;
                p_Var67 = iVar37._M_node;
                p_Var70 = (_Base_ptr)((ulong)((long)p_Var18 + 1) >> 1);
              }
            }
            pvVar56 = pvVar71;
            iVar37._M_node = p_Var67;
          } while (pvVar48 ==
                   (vector<(anonymous_namespace)::JBT<std::__cxx11::string>,std::allocator<(anonymous_namespace)::JBT<std::__cxx11::string>>>
                    *)0x0);
          p_Var70 = (_Base_ptr)p._M_string_length;
          uVar43 = p.field_2._M_allocated_capacity;
          if ((pvVar71 !=
               (vector<(anonymous_namespace)::JBT<std::__cxx11::string>,std::allocator<(anonymous_namespace)::JBT<std::__cxx11::string>>>
                *)0x0) && (p_Var70 = p_Var67, uVar43 = pvVar71, p_Var67 != (_Base_ptr)0x0)) {
            *(vector<(anonymous_namespace)::JBT<std::__cxx11::string>,std::allocator<(anonymous_namespace)::JBT<std::__cxx11::string>>>
              **)pvVar71 = pvVar71 + 0x10;
            pcVar64 = (pJVar46->Value)._M_dataplus._M_p;
            paVar73 = &(pJVar46->Value).field_2;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)pcVar64 == paVar73) {
              lVar47 = *(long *)((long)&(pJVar46->Value).field_2 + 8);
              *(size_type *)(pvVar71 + 0x10) = paVar73->_M_allocated_capacity;
              *(long *)(pvVar71 + 0x18) = lVar47;
            }
            else {
              *(pointer *)pvVar71 = pcVar64;
              *(size_type *)(pvVar71 + 0x10) = paVar73->_M_allocated_capacity;
            }
            pJVar50 = (JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)(pJVar46->Value)._M_string_length;
            *(JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              **)(pvVar71 + 8) = pJVar50;
            (pJVar46->Value)._M_dataplus._M_p = (pointer)paVar73;
            (pJVar46->Value)._M_string_length = 0;
            (pJVar46->Value).field_2._M_local_buf[0] = '\0';
            *(ArrayIndex *)(pvVar71 + 0x20) = (pJVar46->Backtrace).Index;
            if (p_Var67 != (_Base_ptr)&DAT_00000001) {
              lVar47 = (long)p_Var67 * 0x28 + -0x28;
              pvVar56 = pvVar71 + 0x38;
              do {
                pvVar71 = pvVar56;
                *(vector<(anonymous_namespace)::JBT<std::__cxx11::string>,std::allocator<(anonymous_namespace)::JBT<std::__cxx11::string>>>
                  **)(pvVar71 + -0x10) = pvVar71;
                pvVar56 = pvVar71 + -0x28;
                if (pvVar56 ==
                    *(vector<(anonymous_namespace)::JBT<std::__cxx11::string>,std::allocator<(anonymous_namespace)::JBT<std::__cxx11::string>>>
                      **)(pvVar71 + -0x38)) {
                  *(long *)pvVar71 = *(long *)pvVar56;
                  *(long *)(pvVar71 + 8) = *(long *)(pvVar71 + -0x20);
                }
                else {
                  *(vector<(anonymous_namespace)::JBT<std::__cxx11::string>,std::allocator<(anonymous_namespace)::JBT<std::__cxx11::string>>>
                    **)(pvVar71 + -0x10) =
                       *(vector<(anonymous_namespace)::JBT<std::__cxx11::string>,std::allocator<(anonymous_namespace)::JBT<std::__cxx11::string>>>
                         **)(pvVar71 + -0x38);
                  *(long *)pvVar71 = *(long *)(pvVar71 + -0x28);
                }
                *(long *)(pvVar71 + -8) = *(long *)(pvVar71 + -0x30);
                *(vector<(anonymous_namespace)::JBT<std::__cxx11::string>,std::allocator<(anonymous_namespace)::JBT<std::__cxx11::string>>>
                  **)(pvVar71 + -0x38) = pvVar56;
                *(long *)(pvVar71 + -0x30) = 0;
                pvVar71[-0x28] =
                     (vector<(anonymous_namespace)::JBT<std::__cxx11::string>,std::allocator<(anonymous_namespace)::JBT<std::__cxx11::string>>>
                      )0x0;
                pJVar50 = (JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           *)(ulong)*(uint *)(pvVar71 + -0x18);
                *(uint *)(pvVar71 + 0x10) = *(uint *)(pvVar71 + -0x18);
                lVar47 = lVar47 + -0x28;
                pvVar56 = pvVar71 + 0x28;
              } while (lVar47 != 0);
              pvVar71 = pvVar71 + -0x10;
            }
            std::__cxx11::string::operator=((string *)pJVar46,(string *)pvVar71);
            (pJVar46->Backtrace).Index = *(ArrayIndex *)((string *)pvVar71 + 0x20);
          }
          p.field_2._M_allocated_capacity = uVar43;
          p._M_string_length = (size_type)p_Var70;
          if (p.field_2._M_allocated_capacity == 0) {
            std::
            __inplace_stable_sort<__gnu_cxx::__normal_iterator<(anonymous_namespace)::JBT<std::__cxx11::string>*,std::vector<(anonymous_namespace)::JBT<std::__cxx11::string>,std::allocator<(anonymous_namespace)::JBT<std::__cxx11::string>>>>,__gnu_cxx::__ops::_Iter_comp_iter<bool(*)((anonymous_namespace)::JBT<std::__cxx11::string>const&,(anonymous_namespace)::JBT<std::__cxx11::string>const&)>>
                      ((__normal_iterator<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                        )pJVar46,
                       (__normal_iterator<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                        )pJVar61,
                       (_Iter_comp_iter<bool_(*)(const_(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_const_(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&)>
                        )0x4d09f4);
          }
          else {
            pJVar50 = (JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)p._M_string_length;
            std::
            __stable_sort_adaptive<__gnu_cxx::__normal_iterator<(anonymous_namespace)::JBT<std::__cxx11::string>*,std::vector<(anonymous_namespace)::JBT<std::__cxx11::string>,std::allocator<(anonymous_namespace)::JBT<std::__cxx11::string>>>>,(anonymous_namespace)::JBT<std::__cxx11::string>*,long,__gnu_cxx::__ops::_Iter_comp_iter<bool(*)((anonymous_namespace)::JBT<std::__cxx11::string>const&,(anonymous_namespace)::JBT<std::__cxx11::string>const&)>>
                      ((__normal_iterator<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                        )pJVar46,
                       (__normal_iterator<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                        )pJVar61,
                       (JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)p.field_2._M_allocated_capacity,p._M_string_length,
                       (_Iter_comp_iter<bool_(*)(const_(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_const_(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&)>
                        )0x4d09f4);
          }
          std::
          _Temporary_buffer<__gnu_cxx::__normal_iterator<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~_Temporary_buffer
                    ((_Temporary_buffer<__gnu_cxx::__normal_iterator<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)&p);
        }
        pJVar61 = local_268.
                  super__Vector_base<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
        pJVar74 = pJVar61;
        pJVar46 = local_268.
                  super__Vector_base<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        if (local_268.
            super__Vector_base<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start !=
            local_268.
            super__Vector_base<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish) {
          do {
            pJVar72 = pJVar46 + 1;
            pJVar74 = pJVar61;
            if (pJVar72 == pJVar61) break;
            bVar24 = JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     ::ValueEq(pJVar46,pJVar72);
            pJVar74 = pJVar46;
            pJVar46 = pJVar72;
          } while (!bVar24);
        }
        if (pJVar74 != pJVar61) {
          pJVar72 = pJVar74 + 2;
          for (; pJVar72 != pJVar61; pJVar72 = pJVar72 + 1) {
            bVar24 = JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     ::ValueEq(pJVar74,pJVar72);
            this_03 = pJVar74;
            if (!bVar24) {
              this_03 = pJVar74 + 1;
              std::__cxx11::string::operator=((string *)this_03,(string *)pJVar72);
              pJVar74[1].Backtrace.Index = (pJVar72->Backtrace).Index;
            }
            pJVar74 = this_03;
          }
          pJVar61 = pJVar74 + 1;
        }
        pJVar19 = local_268.
                  super__Vector_base<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
        pJVar46 = local_268.
                  super__Vector_base<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
        if (pJVar61 !=
            local_268.
            super__Vector_base<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish) {
          paVar73 = &(pJVar61->Value).field_2;
          do {
            pcVar64 = (((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       (paVar73 + -1))->_M_dataplus)._M_p;
            if (paVar73 !=
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)pcVar64) {
              operator_delete(pcVar64,paVar73->_M_allocated_capacity + 1);
            }
            pJVar74 = (JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)((long)paVar73 + 0x18);
            paVar73 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)((long)paVar73 + 0x28);
            pJVar46 = pJVar61;
          } while (pJVar74 != pJVar19);
        }
      }
      local_268.
      super__Vector_base<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = pJVar46;
      Json::Value::Value((Value *)&installGens,objectValue);
      if (artifact._8_8_ != 0) {
        Json::Value::Value((Value *)&p,(String *)&artifact);
        pVVar29 = Json::Value::operator[]((Value *)&installGens,"language");
        Json::Value::operator=(pVVar29,(Value *)&p);
        Json::Value::~Value((Value *)&p);
      }
      if (local_280.
          super__Vector_base<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start !=
          local_280.
          super__Vector_base<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        Json::Value::Value((Value *)&obj_dir,arrayValue);
        pJVar46 = local_280.
                  super__Vector_base<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
        for (pTVar57 = (Target *)
                       local_280.
                       super__Vector_base<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start; pTVar57 != (Target *)pJVar46;
            pTVar57 = (Target *)((pTVar57->TopSource).field_2._M_local_buf + 8)) {
          local_320 = (BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)0x0;
          local_318._M_allocated_capacity = local_318._M_allocated_capacity & 0xffffffffffffff00;
          __dnew = (size_type)&local_318;
          DumpCommandFragment((Value *)&p,pTVar57,
                              (JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                               *)&__dnew,&pJVar50->Value);
          Json::Value::append((Value *)&obj_dir,(Value *)&p);
          Json::Value::~Value((Value *)&p);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)__dnew != &local_318) {
            operator_delete((void *)__dnew,local_318._M_allocated_capacity + 1);
          }
        }
        pVVar29 = Json::Value::operator[]((Value *)&installGens,"compileCommandFragments");
        Json::Value::operator=(pVVar29,(Value *)&obj_dir);
        Json::Value::~Value((Value *)&obj_dir);
      }
      if (local_238.
          super__Vector_base<(anonymous_namespace)::CompileData::IncludeEntry,_std::allocator<(anonymous_namespace)::CompileData::IncludeEntry>_>
          ._M_impl.super__Vector_impl_data._M_start !=
          local_238.
          super__Vector_base<(anonymous_namespace)::CompileData::IncludeEntry,_std::allocator<(anonymous_namespace)::CompileData::IncludeEntry>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        Json::Value::Value((Value *)&p,arrayValue);
        pIVar20 = local_238.
                  super__Vector_base<(anonymous_namespace)::CompileData::IncludeEntry,_std::allocator<(anonymous_namespace)::CompileData::IncludeEntry>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
        pIVar51 = extraout_RDX_03;
        for (pTVar57 = (Target *)
                       local_238.
                       super__Vector_base<(anonymous_namespace)::CompileData::IncludeEntry,_std::allocator<(anonymous_namespace)::CompileData::IncludeEntry>_>
                       ._M_impl.super__Vector_impl_data._M_start; pTVar57 != (Target *)pIVar20;
            pTVar57 = (Target *)&pTVar57->TopBuild) {
          DumpInclude((Value *)&obj_dir,pTVar57,pIVar51);
          Json::Value::append((Value *)&p,(Value *)&obj_dir);
          Json::Value::~Value((Value *)&obj_dir);
          pIVar51 = extraout_RDX_04;
        }
        pVVar29 = Json::Value::operator[]((Value *)&installGens,"includes");
        Json::Value::operator=(pVVar29,(Value *)&p);
        Json::Value::~Value((Value *)&p);
      }
      if (local_220.
          super__Vector_base<(anonymous_namespace)::CompileData::IncludeEntry,_std::allocator<(anonymous_namespace)::CompileData::IncludeEntry>_>
          ._M_impl.super__Vector_impl_data._M_start !=
          local_220.
          super__Vector_base<(anonymous_namespace)::CompileData::IncludeEntry,_std::allocator<(anonymous_namespace)::CompileData::IncludeEntry>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        Json::Value::Value((Value *)&p,arrayValue);
        pIVar20 = local_220.
                  super__Vector_base<(anonymous_namespace)::CompileData::IncludeEntry,_std::allocator<(anonymous_namespace)::CompileData::IncludeEntry>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
        pIVar51 = extraout_RDX_05;
        for (pTVar57 = (Target *)
                       local_220.
                       super__Vector_base<(anonymous_namespace)::CompileData::IncludeEntry,_std::allocator<(anonymous_namespace)::CompileData::IncludeEntry>_>
                       ._M_impl.super__Vector_impl_data._M_start; pTVar57 != (Target *)pIVar20;
            pTVar57 = (Target *)&pTVar57->TopBuild) {
          DumpInclude((Value *)&obj_dir,pTVar57,pIVar51);
          Json::Value::append((Value *)&p,(Value *)&obj_dir);
          Json::Value::~Value((Value *)&obj_dir);
          pIVar51 = extraout_RDX_06;
        }
        pVVar29 = Json::Value::operator[]((Value *)&installGens,"frameworks");
        Json::Value::operator=(pVVar29,(Value *)&p);
        Json::Value::~Value((Value *)&p);
      }
      if (local_268.
          super__Vector_base<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start !=
          local_268.
          super__Vector_base<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        Json::Value::Value((Value *)&obj_dir,arrayValue);
        pJVar46 = local_268.
                  super__Vector_base<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
        for (pJVar50 = local_268.
                       super__Vector_base<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start; pJVar50 != pJVar46;
            pJVar50 = pJVar50 + 1) {
          Json::Value::Value((Value *)&__dnew,objectValue);
          Json::Value::Value((Value *)&p,&pJVar50->Value);
          pVVar29 = Json::Value::operator[]((Value *)&__dnew,"define");
          Json::Value::operator=(pVVar29,(Value *)&p);
          Json::Value::~Value((Value *)&p);
          AddBacktrace((Target *)&__dnew,(Value *)(ulong)(pJVar50->Backtrace).Index,bt);
          Json::Value::append((Value *)&obj_dir,(Value *)&__dnew);
          Json::Value::~Value((Value *)&__dnew);
        }
        pVVar29 = Json::Value::operator[]((Value *)&installGens,"defines");
        Json::Value::operator=(pVVar29,(Value *)&obj_dir);
        Json::Value::~Value((Value *)&obj_dir);
      }
      if (local_250 != local_248) {
        Json::Value::Value((Value *)&obj_dir,arrayValue);
        pJVar61 = local_248;
        for (pJVar46 = local_250; pJVar46 != pJVar61; pJVar46 = pJVar46 + 1) {
          Json::Value::Value((Value *)&__dnew,objectValue);
          Json::Value::Value((Value *)&p,&pJVar46->Value);
          pVVar29 = Json::Value::operator[]((Value *)&__dnew,"header");
          Json::Value::operator=(pVVar29,(Value *)&p);
          Json::Value::~Value((Value *)&p);
          AddBacktrace((Target *)&__dnew,(Value *)(ulong)(pJVar46->Backtrace).Index,bt_00);
          Json::Value::append((Value *)&obj_dir,(Value *)&__dnew);
          Json::Value::~Value((Value *)&__dnew);
        }
        pVVar29 = Json::Value::operator[]((Value *)&installGens,"precompileHeaders");
        Json::Value::operator=(pVVar29,(Value *)&obj_dir);
        Json::Value::~Value((Value *)&obj_dir);
      }
      if (local_2b0 != (undefined1  [8])0x0) {
        Json::Value::Value((Value *)&__dnew,objectValue);
        Json::Value::Value((Value *)&p,(String *)&local_2b8);
        pVVar29 = Json::Value::operator[]((Value *)&__dnew,"standard");
        Json::Value::operator=(pVVar29,(Value *)&p);
        Json::Value::~Value((Value *)&p);
        if (local_2a8._16_8_ != local_2a8._24_8_) {
          Json::Value::Value((Value *)&p,arrayValue);
          uVar43 = local_2a8._24_8_;
          for (p_Var36 = (_Base_ptr)local_2a8._16_8_; p_Var36 != (_Base_ptr)uVar43;
              p_Var36 = (_Base_ptr)&p_Var36->field_0x4) {
            Json::Value::Value((Value *)&obj_dir,p_Var36->_M_color);
            Json::Value::append((Value *)&p,(Value *)&obj_dir);
            Json::Value::~Value((Value *)&obj_dir);
          }
          pVVar29 = Json::Value::operator[]((Value *)&__dnew,"backtraces");
          Json::Value::operator=(pVVar29,(Value *)&p);
          Json::Value::~Value((Value *)&p);
        }
        pVVar29 = Json::Value::operator[]((Value *)&installGens,"languageStandard");
        Json::Value::operator=(pVVar29,(Value *)&__dnew);
        Json::Value::~Value((Value *)&__dnew);
      }
      CompileData::~CompileData((CompileData *)&artifact);
      pVVar29 = Json::Value::operator[]((Value *)&installGens,"sourceIndexes");
      Json::Value::operator=(pVVar29,&pCVar60->SourceIndexes);
      Json::Value::append(&compileGroups,(Value *)&installGens);
      Json::Value::~Value((Value *)&installGens);
      pCVar60 = pCVar60 + 1;
    } while ((BacktraceData *)pCVar60 != local_130);
  }
  bVar24 = Json::Value::empty(&compileGroups);
  if (!bVar24) {
    pVVar29 = Json::Value::operator[](__return_storage_ptr__,"compileGroups");
    Json::Value::operator=(pVVar29,&compileGroups);
  }
  Json::Value::~Value(&compileGroups);
  Json::Value::~Value(&sourceGroups);
  Json::Value::~Value(&folder);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
               *)local_170);
  Json::Value::~Value(&launchers);
  BacktraceData::Dump(&artifact,&this->Backtraces);
  pVVar29 = Json::Value::operator[](__return_storage_ptr__,"backtraceGraph");
  Json::Value::operator=(pVVar29,&artifact);
  Json::Value::~Value(&artifact);
  Json::Value::~Value(&dependencies);
  return __return_storage_ptr__;
}

Assistant:

Json::Value Target::Dump()
{
  Json::Value target = Json::objectValue;

  cmStateEnums::TargetType const type = this->GT->GetType();

  target["name"] = this->GT->GetName();
  target["type"] = cmState::GetTargetTypeName(type);
  target["id"] = TargetId(this->GT, this->TopBuild);
  target["paths"] = this->DumpPaths();
  if (this->GT->Target->GetIsGeneratorProvided()) {
    target["isGeneratorProvided"] = true;
  }

  this->AddBacktrace(target, this->GT->GetBacktrace());

  if (this->GT->Target->GetHaveInstallRule()) {
    target["install"] = this->DumpInstall();
  }

  if (this->GT->HaveWellDefinedOutputFiles()) {
    Json::Value artifacts = this->DumpArtifacts();
    if (!artifacts.empty()) {
      target["artifacts"] = std::move(artifacts);
    }
  }

  if (type == cmStateEnums::EXECUTABLE ||
      type == cmStateEnums::SHARED_LIBRARY ||
      type == cmStateEnums::MODULE_LIBRARY) {
    target["nameOnDisk"] = this->GT->GetFullName(this->Config);
    target["link"] = this->DumpLink();
  } else if (type == cmStateEnums::STATIC_LIBRARY) {
    target["nameOnDisk"] = this->GT->GetFullName(this->Config);
    target["archive"] = this->DumpArchive();
  }

  if (type == cmStateEnums::EXECUTABLE) {
    Json::Value launchers = this->DumpLaunchers();
    if (!launchers.empty()) {
      target["launchers"] = std::move(launchers);
    }
  }

  Json::Value dependencies = this->DumpDependencies();
  if (!dependencies.empty()) {
    target["dependencies"] = dependencies;
  }

  {
    this->ProcessLanguages();

    auto fileSetInfo = this->DumpFileSets();

    if (!fileSetInfo.first.isNull()) {
      target["fileSets"] = fileSetInfo.first;
    }

    target["sources"] = this->DumpSources(fileSetInfo.second);

    Json::Value folder = this->DumpFolder();
    if (!folder.isNull()) {
      target["folder"] = std::move(folder);
    }

    Json::Value sourceGroups = this->DumpSourceGroups();
    if (!sourceGroups.empty()) {
      target["sourceGroups"] = std::move(sourceGroups);
    }

    Json::Value compileGroups = this->DumpCompileGroups();
    if (!compileGroups.empty()) {
      target["compileGroups"] = std::move(compileGroups);
    }
  }

  target["backtraceGraph"] = this->Backtraces.Dump();

  return target;
}